

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  byte bVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined4 uVar59;
  undefined8 unaff_RBP;
  long lVar60;
  long lVar61;
  bool bVar62;
  bool bVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar88;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar90;
  undefined8 uVar91;
  float fVar117;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar116;
  float fVar118;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar119;
  float fVar133;
  float fVar134;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar135;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  float fVar185;
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  vint4 ai_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar208;
  float fVar223;
  float fVar225;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar224;
  float fVar226;
  undefined1 auVar222 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar234 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar281 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  float fVar308;
  float fVar309;
  undefined1 auVar300 [16];
  float fVar310;
  undefined1 auVar301 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar302 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [32];
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_578 [32];
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_478 [16];
  undefined1 (*local_468) [16];
  Primitive *local_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  uint local_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  undefined1 local_3e8 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  float fVar186;
  float fVar206;
  undefined1 auVar320 [32];
  
  p00.field_0.i[0]._0_1_ = prim[1];
  uVar54 = (ulong)(byte)p00.field_0.i[0]._0_1_;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xf + 6)));
  lVar60 = uVar54 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)p00.field_0.i[0]._0_1_ * 0x10 + 6)))
  ;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x11 + 6)));
  auVar212 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1a + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1b + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x1c + 6)));
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar21 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + lVar60 + 6));
  fVar64 = *(float *)(prim + lVar60 + 0x12);
  fVar65 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar60 + 0x16)) *
           *(float *)(prim + lVar60 + 0x1a);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar256._0_4_ = fVar64 * auVar21._0_4_;
  auVar256._4_4_ = fVar64 * auVar21._4_4_;
  auVar256._8_4_ = fVar64 * auVar21._8_4_;
  auVar256._12_4_ = fVar64 * auVar21._12_4_;
  auVar289._0_4_ = fVar64 * auVar13._0_4_;
  auVar289._4_4_ = fVar64 * auVar13._4_4_;
  auVar289._8_4_ = fVar64 * auVar13._8_4_;
  auVar289._12_4_ = fVar64 * auVar13._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar20);
  auVar20 = vshufps_avx(auVar289,auVar289,0x55);
  auVar21 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar64 = auVar21._0_4_;
  auVar177._0_4_ = fVar64 * auVar15._0_4_;
  fVar66 = auVar21._4_4_;
  auVar177._4_4_ = fVar66 * auVar15._4_4_;
  fVar88 = auVar21._8_4_;
  auVar177._8_4_ = fVar88 * auVar15._8_4_;
  fVar136 = auVar21._12_4_;
  auVar177._12_4_ = fVar136 * auVar15._12_4_;
  auVar243._0_4_ = fVar64 * auVar18._0_4_;
  auVar243._4_4_ = fVar66 * auVar18._4_4_;
  auVar243._8_4_ = fVar88 * auVar18._8_4_;
  auVar243._12_4_ = fVar136 * auVar18._12_4_;
  auVar230._0_4_ = fVar64 * auVar214._0_4_;
  auVar230._4_4_ = fVar66 * auVar214._4_4_;
  auVar230._8_4_ = fVar88 * auVar214._8_4_;
  auVar230._12_4_ = fVar136 * auVar214._12_4_;
  auVar67 = vfmadd231ps_fma(auVar177,auVar20,auVar13);
  auVar68 = vfmadd231ps_fma(auVar243,auVar20,auVar16);
  auVar93 = vfmadd231ps_fma(auVar230,auVar19,auVar20);
  auVar20 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar64 = auVar20._0_4_;
  auVar154._0_4_ = fVar64 * auVar15._0_4_;
  fVar66 = auVar20._4_4_;
  auVar154._4_4_ = fVar66 * auVar15._4_4_;
  fVar88 = auVar20._8_4_;
  auVar154._8_4_ = fVar88 * auVar15._8_4_;
  fVar136 = auVar20._12_4_;
  auVar154._12_4_ = fVar136 * auVar15._12_4_;
  auVar137._0_4_ = fVar64 * auVar18._0_4_;
  auVar137._4_4_ = fVar66 * auVar18._4_4_;
  auVar137._8_4_ = fVar88 * auVar18._8_4_;
  auVar137._12_4_ = fVar136 * auVar18._12_4_;
  auVar311._0_4_ = auVar214._0_4_ * fVar64;
  auVar311._4_4_ = auVar214._4_4_ * fVar66;
  auVar311._8_4_ = auVar214._8_4_ * fVar88;
  auVar311._12_4_ = auVar214._12_4_ * fVar136;
  auVar18 = vshufps_avx(auVar256,auVar256,0x55);
  auVar214 = vfmadd231ps_fma(auVar154,auVar18,auVar13);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar13);
  auVar94 = vfmadd231ps_fma(auVar137,auVar18,auVar16);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar54 * 0xb + 6);
  auVar21 = vpmovsxwd_avx(auVar15);
  auVar120 = vfmadd231ps_fma(auVar311,auVar18,auVar19);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar259 = vpmovsxwd_avx(auVar16);
  auVar13 = vcvtdq2ps_avx(auVar140);
  auVar15 = vcvtdq2ps_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar212);
  auVar273._4_4_ = auVar289._0_4_;
  auVar273._0_4_ = auVar289._0_4_;
  auVar273._8_4_ = auVar289._0_4_;
  auVar273._12_4_ = auVar289._0_4_;
  auVar212 = vfmadd231ps_fma(auVar67,auVar273,auVar13);
  auVar67 = vfmadd231ps_fma(auVar68,auVar273,auVar15);
  auVar68 = vfmadd231ps_fma(auVar93,auVar16,auVar273);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar54 * 0xd + 6);
  auVar140 = vpmovsxwd_avx(auVar18);
  auVar257._4_4_ = auVar256._0_4_;
  auVar257._0_4_ = auVar256._0_4_;
  auVar257._8_4_ = auVar256._0_4_;
  auVar257._12_4_ = auVar256._0_4_;
  auVar93 = vfmadd231ps_fma(auVar214,auVar257,auVar13);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar54 * 0x12 + 6);
  auVar17 = vpmovsxwd_avx(auVar19);
  auVar94 = vfmadd231ps_fma(auVar94,auVar257,auVar15);
  auVar120 = vfmadd231ps_fma(auVar120,auVar257,auVar16);
  local_3e8._8_4_ = 0x7fffffff;
  local_3e8._0_8_ = 0x7fffffff7fffffff;
  local_3e8._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar212,local_3e8);
  auVar258._8_4_ = 0x219392ef;
  auVar258._0_8_ = 0x219392ef219392ef;
  auVar258._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar258,1);
  auVar15 = vblendvps_avx(auVar212,auVar258,auVar13);
  auVar13 = vandps_avx(auVar67,local_3e8);
  auVar13 = vcmpps_avx(auVar13,auVar258,1);
  auVar16 = vblendvps_avx(auVar67,auVar258,auVar13);
  auVar13 = vandps_avx(auVar68,local_3e8);
  auVar13 = vcmpps_avx(auVar13,auVar258,1);
  auVar13 = vblendvps_avx(auVar68,auVar258,auVar13);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar54 * 0x16 + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar281._4_4_ = fVar65;
  auVar281._0_4_ = fVar65;
  auVar281._8_4_ = fVar65;
  auVar281._12_4_ = fVar65;
  auVar18 = vcvtdq2ps_avx(auVar20);
  auVar19 = vcvtdq2ps_avx(auVar21);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar67 = vfmadd213ps_fma(auVar19,auVar281,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar259);
  auVar19 = vcvtdq2ps_avx(auVar140);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar68 = vfmadd213ps_fma(auVar19,auVar281,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar17);
  auVar19 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar19,auVar18);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar54 * 0x14 + 6);
  auVar19 = vpmovsxwd_avx(auVar140);
  auVar140 = vfmadd213ps_fma(auVar214,auVar281,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar54 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar17);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar214 = vsubps_avx(auVar19,auVar18);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar54 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar212);
  auVar17 = vfmadd213ps_fma(auVar214,auVar281,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar54 * 0x21 + 6);
  auVar19 = vpmovsxwd_avx(auVar20);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar214 = vsubps_avx(auVar19,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar54 * 0x1f + 6);
  auVar19 = vpmovsxwd_avx(auVar21);
  auVar214 = vfmadd213ps_fma(auVar214,auVar281,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar259._8_8_ = 0;
  auVar259._0_8_ = *(ulong *)(prim + uVar54 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar259);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar19 = vfmadd213ps_fma(auVar19,auVar281,auVar18);
  auVar18 = vrcpps_avx(auVar15);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar92);
  auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar92);
  auVar16 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar92);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vsubps_avx(auVar67,auVar93);
  auVar169._0_4_ = auVar18._0_4_ * auVar13._0_4_;
  auVar169._4_4_ = auVar18._4_4_ * auVar13._4_4_;
  auVar169._8_4_ = auVar18._8_4_ * auVar13._8_4_;
  auVar169._12_4_ = auVar18._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar68,auVar93);
  auVar155._0_4_ = auVar18._0_4_ * auVar13._0_4_;
  auVar155._4_4_ = auVar18._4_4_ * auVar13._4_4_;
  auVar155._8_4_ = auVar18._8_4_ * auVar13._8_4_;
  auVar155._12_4_ = auVar18._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar140,auVar94);
  auVar187._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar187._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar187._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar187._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar17,auVar94);
  auVar93._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar93._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar93._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar93._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar214,auVar120);
  auVar138._0_4_ = auVar15._0_4_ * auVar13._0_4_;
  auVar138._4_4_ = auVar15._4_4_ * auVar13._4_4_;
  auVar138._8_4_ = auVar15._8_4_ * auVar13._8_4_;
  auVar138._12_4_ = auVar15._12_4_ * auVar13._12_4_;
  auVar13 = vsubps_avx(auVar19,auVar120);
  auVar67._0_4_ = auVar15._0_4_ * auVar13._0_4_;
  auVar67._4_4_ = auVar15._4_4_ * auVar13._4_4_;
  auVar67._8_4_ = auVar15._8_4_ * auVar13._8_4_;
  auVar67._12_4_ = auVar15._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar169,auVar155);
  auVar15 = vpminsd_avx(auVar187,auVar93);
  auVar13 = vmaxps_avx(auVar13,auVar15);
  auVar15 = vpminsd_avx(auVar138,auVar67);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar158._4_4_ = uVar59;
  auVar158._0_4_ = uVar59;
  auVar158._8_4_ = uVar59;
  auVar158._12_4_ = uVar59;
  auVar15 = vmaxps_avx(auVar15,auVar158);
  auVar13 = vmaxps_avx(auVar13,auVar15);
  auVar209._0_4_ = auVar13._0_4_ * 0.99999964;
  auVar209._4_4_ = auVar13._4_4_ * 0.99999964;
  auVar209._8_4_ = auVar13._8_4_ * 0.99999964;
  auVar209._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar169,auVar155);
  auVar15 = vpmaxsd_avx(auVar187,auVar93);
  auVar13 = vminps_avx(auVar13,auVar15);
  auVar15 = vpmaxsd_avx(auVar138,auVar67);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar59;
  auVar120._0_4_ = uVar59;
  auVar120._8_4_ = uVar59;
  auVar120._12_4_ = uVar59;
  auVar15 = vminps_avx(auVar15,auVar120);
  auVar13 = vminps_avx(auVar13,auVar15);
  auVar68._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar68._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar68._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar68._12_4_ = auVar13._12_4_ * 1.0000004;
  p00.field_0.i[0]._1_3_ = 0;
  auVar94[4] = p00.field_0.i[0]._0_1_;
  auVar94._0_4_ = p00.field_0.i[0];
  auVar94._5_3_ = 0;
  auVar94[8] = p00.field_0.i[0]._0_1_;
  auVar94._9_3_ = 0;
  auVar94[0xc] = p00.field_0.i[0]._0_1_;
  auVar94._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar94,_DAT_01f4ad30);
  auVar13 = vcmpps_avx(auVar209,auVar68,2);
  auVar13 = vandps_avx(auVar13,auVar15);
  uVar59 = vmovmskps_avx(auVar13);
  uVar54 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar59);
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  local_468 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_460 = prim;
LAB_0120f66d:
  if (uVar54 == 0) {
LAB_01211731:
    return uVar54 != 0;
  }
  lVar60 = 0;
  for (uVar57 = uVar54; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar53 = *(uint *)(local_460 + 2);
  pGVar6 = (context->scene->geometries).items[uVar53].ptr;
  fVar64 = (pGVar6->time_range).lower;
  fVar64 = pGVar6->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar64) / ((pGVar6->time_range).upper - fVar64));
  auVar13 = vroundss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64),9);
  auVar13 = vminss_avx(auVar13,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar21 = vmaxss_avx(ZEXT816(0),auVar13);
  uVar5 = *(uint *)(local_460 + lVar60 * 4 + 6);
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)uVar5 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar21._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + lVar61);
  lVar9 = *(long *)(_Var7 + 0x10 + lVar61);
  auVar13 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar57);
  lVar60 = uVar57 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar60);
  lVar1 = uVar57 + 2;
  auVar16 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  lVar2 = uVar57 + 3;
  auVar18 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar9 = *(long *)(lVar8 + lVar61);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar61);
  auVar19 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar57);
  auVar214 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar60);
  auVar140 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar17 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  auVar259 = ZEXT816(0) << 0x40;
  auVar244._0_4_ = auVar18._0_4_ * 0.0;
  auVar244._4_4_ = auVar18._4_4_ * 0.0;
  auVar244._8_4_ = auVar18._8_4_ * 0.0;
  auVar244._12_4_ = auVar18._12_4_ * 0.0;
  auVar212 = vfmadd231ps_fma(auVar244,auVar16,auVar259);
  auVar68 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar15,auVar212);
  auVar312._8_4_ = 0x40400000;
  auVar312._0_8_ = 0x4040000040400000;
  auVar312._12_4_ = 0x40400000;
  auVar212 = vfmadd231ps_fma(auVar212,auVar15,auVar312);
  auVar169 = vfnmadd231ps_fma(auVar212,auVar13,auVar312);
  auVar188._0_4_ = auVar17._0_4_ * 0.0;
  auVar188._4_4_ = auVar17._4_4_ * 0.0;
  auVar188._8_4_ = auVar17._8_4_ * 0.0;
  auVar188._12_4_ = auVar17._12_4_ * 0.0;
  auVar20 = vfmadd231ps_fma(auVar188,auVar140,auVar259);
  auVar212 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar214,auVar20);
  auVar231._0_4_ = auVar212._0_4_ + auVar19._0_4_;
  auVar231._4_4_ = auVar212._4_4_ + auVar19._4_4_;
  auVar231._8_4_ = auVar212._8_4_ + auVar19._8_4_;
  auVar231._12_4_ = auVar212._12_4_ + auVar19._12_4_;
  auVar212 = vfmadd231ps_fma(auVar20,auVar214,auVar312);
  auVar20 = vfnmadd231ps_fma(auVar212,auVar19,auVar312);
  auVar93 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar16,auVar18);
  auVar270._0_4_ = auVar18._0_4_ * 3.0;
  auVar270._4_4_ = auVar18._4_4_ * 3.0;
  auVar270._8_4_ = auVar18._8_4_ * 3.0;
  auVar270._12_4_ = auVar18._12_4_ * 3.0;
  auVar16 = vfnmadd231ps_fma(auVar270,auVar312,auVar16);
  auVar16 = vfmadd231ps_fma(auVar16,auVar259,auVar15);
  auVar187 = vfnmadd231ps_fma(auVar16,auVar259,auVar13);
  auVar16 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar140,auVar17);
  auVar16 = vfmadd231ps_fma(auVar16,auVar214,auVar259);
  auVar212 = vfmadd231ps_fma(auVar16,auVar19,auVar259);
  auVar210._0_4_ = auVar17._0_4_ * 3.0;
  auVar210._4_4_ = auVar17._4_4_ * 3.0;
  auVar210._8_4_ = auVar17._8_4_ * 3.0;
  auVar210._12_4_ = auVar17._12_4_ * 3.0;
  auVar16 = vfnmadd231ps_fma(auVar210,auVar312,auVar140);
  auVar16 = vfmadd231ps_fma(auVar16,auVar259,auVar214);
  auVar19 = vfnmadd231ps_fma(auVar16,auVar259,auVar19);
  auVar16 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar18 = vshufps_avx(auVar231,auVar231,0xc9);
  fVar207 = auVar169._0_4_;
  auVar95._0_4_ = fVar207 * auVar18._0_4_;
  fVar223 = auVar169._4_4_;
  auVar95._4_4_ = fVar223 * auVar18._4_4_;
  fVar224 = auVar169._8_4_;
  auVar95._8_4_ = fVar224 * auVar18._8_4_;
  fVar225 = auVar169._12_4_;
  auVar95._12_4_ = fVar225 * auVar18._12_4_;
  auVar120 = vfmsub231ps_fma(auVar95,auVar16,auVar231);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar96._0_4_ = fVar207 * auVar18._0_4_;
  auVar96._4_4_ = fVar223 * auVar18._4_4_;
  auVar96._8_4_ = fVar224 * auVar18._8_4_;
  auVar96._12_4_ = fVar225 * auVar18._12_4_;
  auVar92 = vfmsub231ps_fma(auVar96,auVar16,auVar20);
  auVar16 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar18 = vshufps_avx(auVar212,auVar212,0xc9);
  fVar226 = auVar187._0_4_;
  auVar97._0_4_ = fVar226 * auVar18._0_4_;
  fVar227 = auVar187._4_4_;
  auVar97._4_4_ = fVar227 * auVar18._4_4_;
  fVar228 = auVar187._8_4_;
  auVar97._8_4_ = fVar228 * auVar18._8_4_;
  fVar229 = auVar187._12_4_;
  auVar97._12_4_ = fVar229 * auVar18._12_4_;
  auVar137 = vfmsub231ps_fma(auVar97,auVar16,auVar212);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar98._0_4_ = fVar226 * auVar18._0_4_;
  auVar98._4_4_ = fVar227 * auVar18._4_4_;
  auVar98._8_4_ = fVar228 * auVar18._8_4_;
  auVar98._12_4_ = fVar229 * auVar18._12_4_;
  auVar138 = vfmsub231ps_fma(auVar98,auVar16,auVar19);
  lVar9 = *(long *)(_Var7 + 0x38 + lVar61);
  lVar10 = *(long *)(_Var7 + 0x48 + lVar61);
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar60);
  auVar18 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  auVar19 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar11 = *(long *)(lVar8 + 0x38 + lVar61);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar61);
  auVar232._0_4_ = auVar19._0_4_ * 0.0;
  auVar232._4_4_ = auVar19._4_4_ * 0.0;
  auVar232._8_4_ = auVar19._8_4_ * 0.0;
  auVar232._12_4_ = auVar19._12_4_ * 0.0;
  auVar214 = vfmadd231ps_fma(auVar232,auVar18,auVar259);
  auVar94 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar16,auVar214);
  auVar140 = vfmadd231ps_fma(auVar214,auVar16,auVar312);
  auVar214 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar57);
  auVar230 = vfnmadd231ps_fma(auVar140,auVar214,auVar312);
  auVar140 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar8);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar8 * lVar2);
  auVar290._0_4_ = auVar17._0_4_ * 0.0;
  auVar290._4_4_ = auVar17._4_4_ * 0.0;
  auVar290._8_4_ = auVar17._8_4_ * 0.0;
  auVar290._12_4_ = auVar17._12_4_ * 0.0;
  auVar67 = vfmadd231ps_fma(auVar290,auVar140,auVar259);
  auVar212 = *(undefined1 (*) [16])(lVar11 + lVar60 * lVar8);
  auVar259 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar212,auVar67);
  auVar20 = *(undefined1 (*) [16])(lVar11 + uVar57 * lVar8);
  auVar189._0_4_ = auVar20._0_4_ + auVar259._0_4_;
  auVar189._4_4_ = auVar20._4_4_ + auVar259._4_4_;
  auVar189._8_4_ = auVar20._8_4_ + auVar259._8_4_;
  auVar189._12_4_ = auVar20._12_4_ + auVar259._12_4_;
  auVar259 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar185 = auVar230._0_4_;
  auVar156._0_4_ = fVar185 * auVar259._0_4_;
  fVar186 = auVar230._4_4_;
  auVar156._4_4_ = fVar186 * auVar259._4_4_;
  fVar208 = auVar230._8_4_;
  auVar156._8_4_ = fVar208 * auVar259._8_4_;
  fVar206 = auVar230._12_4_;
  auVar156._12_4_ = fVar206 * auVar259._12_4_;
  auVar259 = vshufps_avx(auVar230,auVar230,0xc9);
  auVar154 = vfmsub231ps_fma(auVar156,auVar259,auVar189);
  auVar67 = vfmadd231ps_fma(auVar67,auVar212,auVar312);
  auVar155 = vfnmadd231ps_fma(auVar67,auVar20,auVar312);
  auVar67 = vshufps_avx(auVar155,auVar155,0xc9);
  auVar157._0_4_ = fVar185 * auVar67._0_4_;
  auVar157._4_4_ = fVar186 * auVar67._4_4_;
  auVar157._8_4_ = fVar208 * auVar67._8_4_;
  auVar157._12_4_ = fVar206 * auVar67._12_4_;
  auVar67 = vfmsub231ps_fma(auVar157,auVar259,auVar155);
  auVar259 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar18,auVar19);
  auVar300._0_4_ = auVar19._0_4_ * 3.0;
  auVar300._4_4_ = auVar19._4_4_ * 3.0;
  auVar300._8_4_ = auVar19._8_4_ * 3.0;
  auVar300._12_4_ = auVar19._12_4_ * 3.0;
  auVar155 = vfnmadd231ps_fma(auVar300,auVar312,auVar18);
  auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar140,auVar17);
  auVar139._0_4_ = auVar17._0_4_ * 3.0;
  auVar139._4_4_ = auVar17._4_4_ * 3.0;
  auVar139._8_4_ = auVar17._8_4_ * 3.0;
  auVar139._12_4_ = auVar17._12_4_ * 3.0;
  auVar19 = vfnmadd231ps_fma(auVar139,auVar312,auVar140);
  auVar158 = ZEXT816(0) << 0x20;
  auVar18 = vfmadd231ps_fma(auVar18,auVar212,auVar158);
  auVar19 = vfmadd231ps_fma(auVar19,auVar158,auVar212);
  auVar140 = vfmadd231ps_fma(auVar18,auVar20,auVar158);
  auVar17 = vfnmadd231ps_fma(auVar19,auVar158,auVar20);
  auVar18 = vfmadd231ps_fma(auVar155,auVar158,auVar16);
  auVar158 = vfnmadd231ps_fma(auVar18,auVar158,auVar214);
  auVar317._12_4_ = 0;
  auVar317._0_12_ = ZEXT812(0);
  auVar18 = vshufps_avx(auVar140,auVar140,0xc9);
  fVar89 = auVar158._0_4_;
  auVar121._0_4_ = fVar89 * auVar18._0_4_;
  fVar308 = auVar158._4_4_;
  auVar121._4_4_ = fVar308 * auVar18._4_4_;
  fVar309 = auVar158._8_4_;
  auVar121._8_4_ = fVar309 * auVar18._8_4_;
  fVar310 = auVar158._12_4_;
  auVar121._12_4_ = fVar310 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar20 = vfmsub231ps_fma(auVar121,auVar18,auVar140);
  auVar19 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar146._0_4_ = fVar89 * auVar19._0_4_;
  auVar146._4_4_ = fVar308 * auVar19._4_4_;
  auVar146._8_4_ = fVar309 * auVar19._8_4_;
  auVar146._12_4_ = fVar310 * auVar19._12_4_;
  auVar155 = vfmsub231ps_fma(auVar146,auVar18,auVar17);
  fVar64 = fVar64 - auVar21._0_4_;
  auVar18 = vfmadd231ps_fma(auVar93,auVar317 << 0x20,auVar15);
  p02.field_0.i[0] = auVar68._0_4_;
  p02.field_0.i[1] = auVar68._4_4_;
  p02.field_0.i[2] = auVar68._8_4_;
  p02.field_0.i[3] = auVar68._12_4_;
  auVar159._0_4_ = auVar13._0_4_ + p02.field_0.v[0];
  auVar159._4_4_ = auVar13._4_4_ + p02.field_0.v[1];
  auVar159._8_4_ = auVar13._8_4_ + p02.field_0.v[2];
  auVar159._12_4_ = auVar13._12_4_ + p02.field_0.v[3];
  auVar19 = vpermilps_avx(auVar120,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar17 = vfmadd231ps_fma(auVar18,auVar13,auVar317 << 0x20);
  fVar66 = auVar15._0_4_;
  auVar140 = ZEXT416((uint)fVar66);
  auVar13 = vrsqrtss_avx(auVar140,auVar140);
  fVar65 = auVar13._0_4_;
  fVar88 = fVar65 * 1.5 - fVar65 * fVar65 * fVar66 * 0.5 * fVar65;
  auVar13 = vpermilps_avx(auVar92,0xc9);
  auVar313._0_4_ = fVar66 * auVar13._0_4_;
  auVar313._4_4_ = fVar66 * auVar13._4_4_;
  auVar313._8_4_ = fVar66 * auVar13._8_4_;
  auVar313._12_4_ = fVar66 * auVar13._12_4_;
  auVar13 = vdpps_avx(auVar19,auVar13,0x7f);
  fVar65 = auVar13._0_4_;
  auVar211._0_4_ = fVar65 * auVar19._0_4_;
  auVar211._4_4_ = fVar65 * auVar19._4_4_;
  auVar211._8_4_ = fVar65 * auVar19._8_4_;
  auVar211._12_4_ = fVar65 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar313,auVar211);
  auVar13 = vrcpss_avx(auVar140,auVar140);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar13,SUB6416(ZEXT464(0x40000000),0));
  fVar65 = auVar13._0_4_ * auVar15._0_4_;
  fVar90 = auVar19._0_4_ * fVar88;
  fVar116 = auVar19._4_4_ * fVar88;
  fVar117 = auVar19._8_4_ * fVar88;
  fVar118 = auVar19._12_4_ * fVar88;
  auVar140 = vpermilps_avx(auVar137,0xc9);
  auVar13 = vdpps_avx(auVar140,auVar140,0x7f);
  fVar66 = auVar13._0_4_;
  auVar212 = ZEXT416((uint)fVar66);
  auVar15 = vrsqrtss_avx(auVar212,auVar212);
  fVar136 = auVar15._0_4_;
  auVar19 = vpermilps_avx(auVar138,0xc9);
  auVar15 = vdpps_avx(auVar140,auVar19,0x7f);
  fVar136 = fVar136 * 1.5 - fVar136 * fVar136 * fVar136 * fVar66 * 0.5;
  auVar260._0_4_ = fVar66 * auVar19._0_4_;
  auVar260._4_4_ = fVar66 * auVar19._4_4_;
  auVar260._8_4_ = fVar66 * auVar19._8_4_;
  auVar260._12_4_ = fVar66 * auVar19._12_4_;
  fVar66 = auVar15._0_4_;
  auVar69._0_4_ = auVar140._0_4_ * fVar66;
  auVar69._4_4_ = auVar140._4_4_ * fVar66;
  auVar69._8_4_ = auVar140._8_4_ * fVar66;
  auVar69._12_4_ = auVar140._12_4_ * fVar66;
  auVar19 = vsubps_avx(auVar260,auVar69);
  auVar15 = vrcpss_avx(auVar212,auVar212);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar66 = auVar15._0_4_ * auVar13._0_4_;
  fVar119 = auVar140._0_4_ * fVar136;
  fVar133 = auVar140._4_4_ * fVar136;
  fVar134 = auVar140._8_4_ * fVar136;
  fVar135 = auVar140._12_4_ * fVar136;
  auVar13 = vshufps_avx(auVar169,auVar169,0xff);
  auVar15 = vshufps_avx(auVar159,auVar159,0xff);
  auVar213._0_4_ = auVar15._0_4_ * fVar90;
  auVar213._4_4_ = auVar15._4_4_ * fVar116;
  auVar213._8_4_ = auVar15._8_4_ * fVar117;
  auVar213._12_4_ = auVar15._12_4_ * fVar118;
  auVar141._0_4_ = auVar13._0_4_ * fVar90 + auVar15._0_4_ * fVar88 * fVar65 * auVar18._0_4_;
  auVar141._4_4_ = auVar13._4_4_ * fVar116 + auVar15._4_4_ * fVar88 * fVar65 * auVar18._4_4_;
  auVar141._8_4_ = auVar13._8_4_ * fVar117 + auVar15._8_4_ * fVar88 * fVar65 * auVar18._8_4_;
  auVar141._12_4_ = auVar13._12_4_ * fVar118 + auVar15._12_4_ * fVar88 * fVar65 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar159,auVar213);
  p01.field_0.v[1] = auVar159._4_4_ + auVar213._4_4_;
  p01.field_0.v[0] = auVar159._0_4_ + auVar213._0_4_;
  p01.field_0.v[2] = auVar159._8_4_ + auVar213._8_4_;
  p01.field_0.v[3] = auVar159._12_4_ + auVar213._12_4_;
  auVar140 = vsubps_avx(auVar169,auVar141);
  auVar13 = vshufps_avx(auVar187,auVar187,0xff);
  auVar15 = vshufps_avx(auVar17,auVar17,0xff);
  auVar170._0_4_ = auVar15._0_4_ * fVar119;
  auVar170._4_4_ = auVar15._4_4_ * fVar133;
  auVar170._8_4_ = auVar15._8_4_ * fVar134;
  auVar170._12_4_ = auVar15._12_4_ * fVar135;
  auVar142._0_4_ = auVar13._0_4_ * fVar119 + auVar15._0_4_ * fVar136 * auVar19._0_4_ * fVar66;
  auVar142._4_4_ = auVar13._4_4_ * fVar133 + auVar15._4_4_ * fVar136 * auVar19._4_4_ * fVar66;
  auVar142._8_4_ = auVar13._8_4_ * fVar134 + auVar15._8_4_ * fVar136 * auVar19._8_4_ * fVar66;
  auVar142._12_4_ = auVar13._12_4_ * fVar135 + auVar15._12_4_ * fVar136 * auVar19._12_4_ * fVar66;
  auVar19 = vsubps_avx(auVar17,auVar170);
  local_648._4_4_ = auVar17._4_4_ + auVar170._4_4_;
  local_648._0_4_ = auVar17._0_4_ + auVar170._0_4_;
  uStack_640._0_4_ = auVar17._8_4_ + auVar170._8_4_;
  uStack_640._4_4_ = auVar17._12_4_ + auVar170._12_4_;
  auVar17 = vsubps_avx(auVar187,auVar142);
  auVar15 = vfmadd231ps_fma(auVar259,ZEXT416(0) << 0x20,auVar16);
  auVar212 = vpermilps_avx(auVar154,0xc9);
  auVar13 = vdpps_avx(auVar212,auVar212,0x7f);
  local_598 = auVar94._0_4_;
  fStack_594 = auVar94._4_4_;
  fStack_590 = auVar94._8_4_;
  fStack_58c = auVar94._12_4_;
  auVar143._0_4_ = auVar214._0_4_ + local_598;
  auVar143._4_4_ = auVar214._4_4_ + fStack_594;
  auVar143._8_4_ = auVar214._8_4_ + fStack_590;
  auVar143._12_4_ = auVar214._12_4_ + fStack_58c;
  auVar21 = vfmadd231ps_fma(auVar15,auVar214,ZEXT416(0) << 0x20);
  auVar16 = vpermilps_avx(auVar67,0xc9);
  fVar65 = auVar13._0_4_;
  auVar214 = ZEXT416((uint)fVar65);
  auVar15 = vrsqrtss_avx(auVar214,auVar214);
  fVar66 = auVar15._0_4_;
  auVar15 = vdpps_avx(auVar212,auVar16,0x7f);
  fVar88 = fVar66 * 1.5 - fVar65 * 0.5 * fVar66 * fVar66 * fVar66;
  auVar190._0_4_ = fVar65 * auVar16._0_4_;
  auVar190._4_4_ = fVar65 * auVar16._4_4_;
  auVar190._8_4_ = fVar65 * auVar16._8_4_;
  auVar190._12_4_ = fVar65 * auVar16._12_4_;
  fVar65 = auVar15._0_4_;
  auVar271._0_4_ = fVar65 * auVar212._0_4_;
  auVar271._4_4_ = fVar65 * auVar212._4_4_;
  auVar271._8_4_ = fVar65 * auVar212._8_4_;
  auVar271._12_4_ = fVar65 * auVar212._12_4_;
  auVar16 = vsubps_avx(auVar190,auVar271);
  auVar15 = vrcpss_avx(auVar214,auVar214);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar65 = auVar15._0_4_ * auVar13._0_4_;
  auVar20 = vpermilps_avx(auVar20,0xc9);
  fVar90 = auVar212._0_4_ * fVar88;
  fVar116 = auVar212._4_4_ * fVar88;
  fVar117 = auVar212._8_4_ * fVar88;
  fVar118 = auVar212._12_4_ * fVar88;
  auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar66 = auVar13._0_4_;
  auVar212 = ZEXT416((uint)fVar66);
  auVar15 = vrsqrtss_avx(auVar212,auVar212);
  fVar136 = auVar15._0_4_;
  fVar136 = fVar136 * 1.5 - fVar66 * 0.5 * fVar136 * fVar136 * fVar136;
  auVar15 = vpermilps_avx(auVar155,0xc9);
  auVar314._0_4_ = fVar66 * auVar15._0_4_;
  auVar314._4_4_ = fVar66 * auVar15._4_4_;
  auVar314._8_4_ = fVar66 * auVar15._8_4_;
  auVar314._12_4_ = fVar66 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar20,auVar15,0x7f);
  fVar66 = auVar15._0_4_;
  auVar278._0_4_ = fVar66 * auVar20._0_4_;
  auVar278._4_4_ = fVar66 * auVar20._4_4_;
  auVar278._8_4_ = fVar66 * auVar20._8_4_;
  auVar278._12_4_ = fVar66 * auVar20._12_4_;
  auVar214 = vsubps_avx(auVar314,auVar278);
  auVar15 = vrcpss_avx(auVar212,auVar212);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar66 = auVar15._0_4_ * auVar13._0_4_;
  fVar119 = fVar136 * auVar20._0_4_;
  fVar133 = fVar136 * auVar20._4_4_;
  fVar134 = fVar136 * auVar20._8_4_;
  fVar135 = fVar136 * auVar20._12_4_;
  auVar13 = vshufps_avx(auVar230,auVar230,0xff);
  auVar15 = vshufps_avx(auVar143,auVar143,0xff);
  auVar171._0_4_ = auVar15._0_4_ * fVar90;
  auVar171._4_4_ = auVar15._4_4_ * fVar116;
  auVar171._8_4_ = auVar15._8_4_ * fVar117;
  auVar171._12_4_ = auVar15._12_4_ * fVar118;
  auVar191._0_4_ = auVar13._0_4_ * fVar90 + auVar15._0_4_ * fVar88 * fVar65 * auVar16._0_4_;
  auVar191._4_4_ = auVar13._4_4_ * fVar116 + auVar15._4_4_ * fVar88 * fVar65 * auVar16._4_4_;
  auVar191._8_4_ = auVar13._8_4_ * fVar117 + auVar15._8_4_ * fVar88 * fVar65 * auVar16._8_4_;
  auVar191._12_4_ = auVar13._12_4_ * fVar118 + auVar15._12_4_ * fVar88 * fVar65 * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar143,auVar171);
  auVar212 = vsubps_avx(auVar230,auVar191);
  auVar13 = vshufps_avx(auVar158,auVar158,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar215._0_4_ = auVar15._0_4_ * fVar119;
  auVar215._4_4_ = auVar15._4_4_ * fVar133;
  auVar215._8_4_ = auVar15._8_4_ * fVar134;
  auVar215._12_4_ = auVar15._12_4_ * fVar135;
  auVar245._0_4_ = auVar15._0_4_ * fVar136 * auVar214._0_4_ * fVar66 + auVar13._0_4_ * fVar119;
  auVar245._4_4_ = auVar15._4_4_ * fVar136 * auVar214._4_4_ * fVar66 + auVar13._4_4_ * fVar133;
  auVar245._8_4_ = auVar15._8_4_ * fVar136 * auVar214._8_4_ * fVar66 + auVar13._8_4_ * fVar134;
  auVar245._12_4_ = auVar15._12_4_ * fVar136 * auVar214._12_4_ * fVar66 + auVar13._12_4_ * fVar135;
  auVar13 = vsubps_avx(auVar21,auVar215);
  auVar172._0_4_ = auVar21._0_4_ + auVar215._0_4_;
  auVar172._4_4_ = auVar21._4_4_ + auVar215._4_4_;
  auVar172._8_4_ = auVar21._8_4_ + auVar215._8_4_;
  auVar172._12_4_ = auVar21._12_4_ + auVar215._12_4_;
  auVar15 = vsubps_avx(auVar158,auVar245);
  local_4e8 = auVar140._0_4_;
  fStack_4e4 = auVar140._4_4_;
  fStack_4e0 = auVar140._8_4_;
  fStack_4dc = auVar140._12_4_;
  auVar144._0_4_ = auVar18._0_4_ + local_4e8 * 0.33333334;
  auVar144._4_4_ = auVar18._4_4_ + fStack_4e4 * 0.33333334;
  auVar144._8_4_ = auVar18._8_4_ + fStack_4e0 * 0.33333334;
  auVar144._12_4_ = auVar18._12_4_ + fStack_4dc * 0.33333334;
  fVar65 = 1.0 - fVar64;
  auVar216._4_4_ = fVar65;
  auVar216._0_4_ = fVar65;
  auVar216._8_4_ = fVar65;
  auVar216._12_4_ = fVar65;
  auVar291._0_4_ = fVar64 * auVar16._0_4_;
  auVar291._4_4_ = fVar64 * auVar16._4_4_;
  auVar291._8_4_ = fVar64 * auVar16._8_4_;
  auVar291._12_4_ = fVar64 * auVar16._12_4_;
  local_428 = vfmadd231ps_fma(auVar291,auVar216,auVar18);
  auVar70._0_4_ = fVar64 * (auVar16._0_4_ + auVar212._0_4_ * 0.33333334);
  auVar70._4_4_ = fVar64 * (auVar16._4_4_ + auVar212._4_4_ * 0.33333334);
  auVar70._8_4_ = fVar64 * (auVar16._8_4_ + auVar212._8_4_ * 0.33333334);
  auVar70._12_4_ = fVar64 * (auVar16._12_4_ + auVar212._12_4_ * 0.33333334);
  auVar137 = vfmadd231ps_fma(auVar70,auVar216,auVar144);
  local_528._0_4_ = auVar17._0_4_;
  local_528._4_4_ = auVar17._4_4_;
  uStack_520._0_4_ = auVar17._8_4_;
  uStack_520._4_4_ = auVar17._12_4_;
  auVar99._0_4_ = (float)local_528._0_4_ * 0.33333334;
  auVar99._4_4_ = (float)local_528._4_4_ * 0.33333334;
  auVar99._8_4_ = (float)uStack_520 * 0.33333334;
  auVar99._12_4_ = uStack_520._4_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar19,auVar99);
  auVar272._0_4_ = auVar159._0_4_ + auVar213._0_4_ + (fVar207 + auVar141._0_4_) * 0.33333334;
  auVar272._4_4_ = auVar159._4_4_ + auVar213._4_4_ + (fVar223 + auVar141._4_4_) * 0.33333334;
  auVar272._8_4_ = auVar159._8_4_ + auVar213._8_4_ + (fVar224 + auVar141._8_4_) * 0.33333334;
  auVar272._12_4_ = auVar159._12_4_ + auVar213._12_4_ + (fVar225 + auVar141._12_4_) * 0.33333334;
  auVar160._0_4_ = (fVar226 + auVar142._0_4_) * 0.33333334;
  auVar160._4_4_ = (fVar227 + auVar142._4_4_) * 0.33333334;
  auVar160._8_4_ = (fVar228 + auVar142._8_4_) * 0.33333334;
  auVar160._12_4_ = (fVar229 + auVar142._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_648,auVar160);
  auVar279._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar279._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar279._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar279._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar13,auVar279);
  auVar246._0_4_ = (fVar89 + auVar245._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar308 + auVar245._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar309 + auVar245._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar310 + auVar245._12_4_) * 0.33333334;
  auVar214 = vsubps_avx(auVar172,auVar246);
  auVar280._0_4_ = fVar64 * auVar15._0_4_;
  auVar280._4_4_ = fVar64 * auVar15._4_4_;
  auVar280._8_4_ = fVar64 * auVar15._8_4_;
  auVar280._12_4_ = fVar64 * auVar15._12_4_;
  auVar233._0_4_ = fVar64 * auVar13._0_4_;
  auVar233._4_4_ = fVar64 * auVar13._4_4_;
  auVar233._8_4_ = fVar64 * auVar13._8_4_;
  auVar233._12_4_ = fVar64 * auVar13._12_4_;
  local_438 = vfmadd231ps_fma(auVar280,auVar216,auVar16);
  auVar138 = vfmadd231ps_fma(auVar233,auVar216,auVar19);
  auVar100._0_4_ = fVar64 * (auVar143._0_4_ + auVar171._0_4_);
  auVar100._4_4_ = fVar64 * (auVar143._4_4_ + auVar171._4_4_);
  auVar100._8_4_ = fVar64 * (auVar143._8_4_ + auVar171._8_4_);
  auVar100._12_4_ = fVar64 * (auVar143._12_4_ + auVar171._12_4_);
  auVar122._0_4_ =
       fVar64 * (auVar143._0_4_ + auVar171._0_4_ + (fVar185 + auVar191._0_4_) * 0.33333334);
  auVar122._4_4_ =
       fVar64 * (auVar143._4_4_ + auVar171._4_4_ + (fVar186 + auVar191._4_4_) * 0.33333334);
  auVar122._8_4_ =
       fVar64 * (auVar143._8_4_ + auVar171._8_4_ + (fVar208 + auVar191._8_4_) * 0.33333334);
  auVar122._12_4_ =
       fVar64 * (auVar143._12_4_ + auVar171._12_4_ + (fVar206 + auVar191._12_4_) * 0.33333334);
  auVar192._0_4_ = fVar64 * auVar214._0_4_;
  auVar192._4_4_ = fVar64 * auVar214._4_4_;
  auVar192._8_4_ = fVar64 * auVar214._8_4_;
  auVar192._12_4_ = fVar64 * auVar214._12_4_;
  auVar173._0_4_ = fVar64 * auVar172._0_4_;
  auVar173._4_4_ = fVar64 * auVar172._4_4_;
  auVar173._8_4_ = fVar64 * auVar172._8_4_;
  auVar173._12_4_ = fVar64 * auVar172._12_4_;
  _local_448 = vfmadd231ps_fma(auVar100,auVar216,(undefined1  [16])p01.field_0);
  _local_458 = vfmadd231ps_fma(auVar122,auVar216,auVar272);
  auVar154 = vfmadd231ps_fma(auVar192,auVar216,auVar18);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar155 = vfmadd231ps_fma(auVar173,auVar216,_local_648);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_408 = vsubps_avx(local_428,auVar13);
  auVar15 = vshufps_avx(local_408,local_408,0x55);
  auVar16 = vshufps_avx(local_408,local_408,0xaa);
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar64 = pre->ray_space[k].vz.field_0.m128[0];
  fVar65 = pre->ray_space[k].vz.field_0.m128[1];
  fVar66 = pre->ray_space[k].vz.field_0.m128[2];
  fVar88 = pre->ray_space[k].vz.field_0.m128[3];
  auVar71._0_4_ = fVar64 * auVar16._0_4_;
  auVar71._4_4_ = fVar65 * auVar16._4_4_;
  auVar71._8_4_ = fVar66 * auVar16._8_4_;
  auVar71._12_4_ = fVar88 * auVar16._12_4_;
  auVar18 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar4,auVar15);
  local_418 = vsubps_avx(auVar137,auVar13);
  auVar15 = vshufps_avx(local_418,local_418,0x55);
  auVar16 = vshufps_avx(local_418,local_418,0xaa);
  auVar315._0_4_ = fVar64 * auVar16._0_4_;
  auVar315._4_4_ = fVar65 * auVar16._4_4_;
  auVar315._8_4_ = fVar66 * auVar16._8_4_;
  auVar315._12_4_ = fVar88 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar315,(undefined1  [16])aVar4,auVar15);
  auVar17 = vsubps_avx(local_438,auVar13);
  auVar15 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar292._0_4_ = fVar64 * auVar15._0_4_;
  auVar292._4_4_ = fVar65 * auVar15._4_4_;
  auVar292._8_4_ = fVar66 * auVar15._8_4_;
  auVar292._12_4_ = fVar88 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar17,auVar17,0x55);
  auVar19 = vfmadd231ps_fma(auVar292,(undefined1  [16])aVar4,auVar15);
  auVar212 = vsubps_avx(auVar138,auVar13);
  auVar15 = vshufps_avx(auVar212,auVar212,0xaa);
  auVar301._0_4_ = fVar64 * auVar15._0_4_;
  auVar301._4_4_ = fVar65 * auVar15._4_4_;
  auVar301._8_4_ = fVar66 * auVar15._8_4_;
  auVar301._12_4_ = fVar88 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar212,auVar212,0x55);
  auVar214 = vfmadd231ps_fma(auVar301,(undefined1  [16])aVar4,auVar15);
  auVar20 = vsubps_avx(_local_448,auVar13);
  auVar15 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar161._0_4_ = fVar64 * auVar15._0_4_;
  auVar161._4_4_ = fVar65 * auVar15._4_4_;
  auVar161._8_4_ = fVar66 * auVar15._8_4_;
  auVar161._12_4_ = fVar88 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar20,auVar20,0x55);
  auVar140 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar4,auVar15);
  auVar21 = vsubps_avx(_local_458,auVar13);
  auVar15 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar217._0_4_ = fVar64 * auVar15._0_4_;
  auVar217._4_4_ = fVar65 * auVar15._4_4_;
  auVar217._8_4_ = fVar66 * auVar15._8_4_;
  auVar217._12_4_ = fVar88 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar21,auVar21,0x55);
  auVar68 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar4,auVar15);
  auVar259 = vsubps_avx(auVar154,auVar13);
  auVar15 = vshufps_avx(auVar259,auVar259,0xaa);
  auVar247._0_4_ = fVar64 * auVar15._0_4_;
  auVar247._4_4_ = fVar65 * auVar15._4_4_;
  auVar247._8_4_ = fVar66 * auVar15._8_4_;
  auVar247._12_4_ = fVar88 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar259,auVar259,0x55);
  auVar15 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar4,auVar15);
  auVar67 = vsubps_avx(auVar155,auVar13);
  auVar13 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar174._0_4_ = fVar64 * auVar13._0_4_;
  auVar174._4_4_ = fVar65 * auVar13._4_4_;
  auVar174._8_4_ = fVar66 * auVar13._8_4_;
  auVar174._12_4_ = fVar88 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar67,auVar67,0x55);
  auVar13 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar4,auVar13);
  auVar193._4_4_ = local_408._0_4_;
  auVar193._0_4_ = local_408._0_4_;
  auVar193._8_4_ = local_408._0_4_;
  auVar193._12_4_ = local_408._0_4_;
  aVar4 = pre->ray_space[k].vx.field_0;
  auVar93 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar4,auVar193);
  auVar194._4_4_ = local_418._0_4_;
  auVar194._0_4_ = local_418._0_4_;
  auVar194._8_4_ = local_418._0_4_;
  auVar194._12_4_ = local_418._0_4_;
  auVar94 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar4,auVar194);
  uVar59 = auVar17._0_4_;
  auVar195._4_4_ = uVar59;
  auVar195._0_4_ = uVar59;
  auVar195._8_4_ = uVar59;
  auVar195._12_4_ = uVar59;
  auVar120 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar4,auVar195);
  uVar59 = auVar212._0_4_;
  auVar196._4_4_ = uVar59;
  auVar196._0_4_ = uVar59;
  auVar196._8_4_ = uVar59;
  auVar196._12_4_ = uVar59;
  auVar92 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar4,auVar196);
  uVar59 = auVar20._0_4_;
  auVar197._4_4_ = uVar59;
  auVar197._0_4_ = uVar59;
  auVar197._8_4_ = uVar59;
  auVar197._12_4_ = uVar59;
  auVar169 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar4,auVar197);
  uVar59 = auVar21._0_4_;
  auVar198._4_4_ = uVar59;
  auVar198._0_4_ = uVar59;
  auVar198._8_4_ = uVar59;
  auVar198._12_4_ = uVar59;
  auVar187 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar4,auVar198);
  uVar59 = auVar259._0_4_;
  auVar199._4_4_ = uVar59;
  auVar199._0_4_ = uVar59;
  auVar199._8_4_ = uVar59;
  auVar199._12_4_ = uVar59;
  auVar230 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar4,auVar199);
  uVar59 = auVar67._0_4_;
  auVar200._4_4_ = uVar59;
  auVar200._0_4_ = uVar59;
  auVar200._8_4_ = uVar59;
  auVar200._12_4_ = uVar59;
  auVar158 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar4,auVar200);
  auVar18 = vmovlhps_avx(auVar93,auVar169);
  auVar19 = vmovlhps_avx(auVar94,auVar187);
  auVar214 = vmovlhps_avx(auVar120,auVar230);
  auVar140 = vmovlhps_avx(auVar92,auVar158);
  auVar13 = vminps_avx(auVar18,auVar19);
  auVar15 = vminps_avx(auVar214,auVar140);
  auVar16 = vminps_avx(auVar13,auVar15);
  auVar13 = vmaxps_avx(auVar18,auVar19);
  auVar15 = vmaxps_avx(auVar214,auVar140);
  auVar13 = vmaxps_avx(auVar13,auVar15);
  auVar15 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vminps_avx(auVar16,auVar15);
  auVar15 = vshufpd_avx(auVar13,auVar13,3);
  auVar15 = vmaxps_avx(auVar13,auVar15);
  auVar13 = vandps_avx(local_3e8,auVar16);
  auVar15 = vandps_avx(auVar15,local_3e8);
  auVar13 = vmaxps_avx(auVar13,auVar15);
  auVar15 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar15,auVar13);
  fVar65 = auVar13._0_4_ * 9.536743e-07;
  auVar234._8_8_ = auVar93._0_8_;
  auVar234._0_8_ = auVar93._0_8_;
  auVar261._8_8_ = auVar94._0_8_;
  auVar261._0_8_ = auVar94._0_8_;
  auVar293._0_8_ = auVar120._0_8_;
  auVar293._8_8_ = auVar293._0_8_;
  auVar302._0_8_ = auVar92._0_8_;
  auVar302._8_8_ = auVar302._0_8_;
  local_3f8 = 0x80000000;
  uStack_3f4 = 0x80000000;
  uStack_3f0 = 0x80000000;
  uStack_3ec = 0x80000000;
  local_78 = fVar65;
  fStack_74 = fVar65;
  fStack_70 = fVar65;
  fStack_6c = fVar65;
  fStack_68 = fVar65;
  fStack_64 = fVar65;
  fStack_60 = fVar65;
  fStack_5c = fVar65;
  fStack_90 = -fVar65;
  local_98 = -fVar65;
  fStack_94 = -fVar65;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar62 = false;
  uVar57 = 0;
  fVar64 = *(float *)(ray + k * 4 + 0x30);
  auVar15 = vsubps_avx(auVar19,auVar18);
  auVar16 = vsubps_avx(auVar214,auVar19);
  auVar68 = vsubps_avx(auVar140,auVar214);
  auVar93 = vsubps_avx(_local_448,local_428);
  auVar94 = vsubps_avx(_local_458,auVar137);
  auVar120 = vsubps_avx(auVar154,local_438);
  auVar92 = vsubps_avx(auVar155,auVar138);
  auVar72 = ZEXT816(0x3f80000000000000);
  auVar13 = auVar72;
LAB_012102c7:
  auVar243 = vshufps_avx(auVar72,auVar72,0x50);
  auVar316._8_4_ = 0x3f800000;
  auVar316._0_8_ = 0x3f8000003f800000;
  auVar316._12_4_ = 0x3f800000;
  auVar320._16_4_ = 0x3f800000;
  auVar320._0_16_ = auVar316;
  auVar320._20_4_ = 0x3f800000;
  auVar320._24_4_ = 0x3f800000;
  auVar320._28_4_ = 0x3f800000;
  auVar256 = vsubps_avx(auVar316,auVar243);
  fVar66 = auVar243._0_4_;
  fVar133 = auVar169._0_4_;
  auVar73._0_4_ = fVar133 * fVar66;
  fVar88 = auVar243._4_4_;
  fVar134 = auVar169._4_4_;
  auVar73._4_4_ = fVar134 * fVar88;
  fVar136 = auVar243._8_4_;
  auVar73._8_4_ = fVar133 * fVar136;
  fVar90 = auVar243._12_4_;
  auVar73._12_4_ = fVar134 * fVar90;
  fVar186 = auVar187._0_4_;
  auVar201._0_4_ = fVar186 * fVar66;
  fVar206 = auVar187._4_4_;
  auVar201._4_4_ = fVar206 * fVar88;
  auVar201._8_4_ = fVar186 * fVar136;
  auVar201._12_4_ = fVar206 * fVar90;
  fVar207 = auVar230._0_4_;
  auVar162._0_4_ = fVar207 * fVar66;
  fVar223 = auVar230._4_4_;
  auVar162._4_4_ = fVar223 * fVar88;
  auVar162._8_4_ = fVar207 * fVar136;
  auVar162._12_4_ = fVar223 * fVar90;
  fVar135 = auVar158._0_4_;
  auVar123._0_4_ = fVar135 * fVar66;
  fVar185 = auVar158._4_4_;
  auVar123._4_4_ = fVar185 * fVar88;
  auVar123._8_4_ = fVar135 * fVar136;
  auVar123._12_4_ = fVar185 * fVar90;
  auVar281 = vfmadd231ps_fma(auVar73,auVar256,auVar234);
  auVar177 = vfmadd231ps_fma(auVar201,auVar256,auVar261);
  auVar289 = vfmadd231ps_fma(auVar162,auVar256,auVar293);
  auVar273 = vfmadd231ps_fma(auVar123,auVar302,auVar256);
  auVar243 = vmovshdup_avx(auVar13);
  fVar66 = auVar13._0_4_;
  fStack_120 = (auVar243._0_4_ - fVar66) * 0.04761905;
  auVar255._4_4_ = fVar66;
  auVar255._0_4_ = fVar66;
  auVar255._8_4_ = fVar66;
  auVar255._12_4_ = fVar66;
  auVar255._16_4_ = fVar66;
  auVar255._20_4_ = fVar66;
  auVar255._24_4_ = fVar66;
  auVar255._28_4_ = fVar66;
  auVar112._0_8_ = auVar243._0_8_;
  auVar112._8_8_ = auVar112._0_8_;
  auVar112._16_8_ = auVar112._0_8_;
  auVar112._24_8_ = auVar112._0_8_;
  auVar85 = vsubps_avx(auVar112,auVar255);
  uVar59 = auVar281._0_4_;
  auVar306._4_4_ = uVar59;
  auVar306._0_4_ = uVar59;
  auVar306._8_4_ = uVar59;
  auVar306._12_4_ = uVar59;
  auVar306._16_4_ = uVar59;
  auVar306._20_4_ = uVar59;
  auVar306._24_4_ = uVar59;
  auVar306._28_4_ = uVar59;
  auVar243 = vmovshdup_avx(auVar281);
  uVar91 = auVar243._0_8_;
  auVar299._8_8_ = uVar91;
  auVar299._0_8_ = uVar91;
  auVar299._16_8_ = uVar91;
  auVar299._24_8_ = uVar91;
  fVar208 = auVar177._0_4_;
  auVar286._4_4_ = fVar208;
  auVar286._0_4_ = fVar208;
  auVar286._8_4_ = fVar208;
  auVar286._12_4_ = fVar208;
  auVar286._16_4_ = fVar208;
  auVar286._20_4_ = fVar208;
  auVar286._24_4_ = fVar208;
  auVar286._28_4_ = fVar208;
  auVar256 = vmovshdup_avx(auVar177);
  auVar113._0_8_ = auVar256._0_8_;
  auVar113._8_8_ = auVar113._0_8_;
  auVar113._16_8_ = auVar113._0_8_;
  auVar113._24_8_ = auVar113._0_8_;
  fVar119 = auVar289._0_4_;
  auVar220._4_4_ = fVar119;
  auVar220._0_4_ = fVar119;
  auVar220._8_4_ = fVar119;
  auVar220._12_4_ = fVar119;
  auVar220._16_4_ = fVar119;
  auVar220._20_4_ = fVar119;
  auVar220._24_4_ = fVar119;
  auVar220._28_4_ = fVar119;
  auVar257 = vmovshdup_avx(auVar289);
  auVar240._0_8_ = auVar257._0_8_;
  auVar240._8_8_ = auVar240._0_8_;
  auVar240._16_8_ = auVar240._0_8_;
  auVar240._24_8_ = auVar240._0_8_;
  fVar118 = auVar273._0_4_;
  auVar258 = vmovshdup_avx(auVar273);
  auVar311 = vfmadd132ps_fma(auVar85,auVar255,_DAT_01f7b040);
  auVar85 = vsubps_avx(auVar320,ZEXT1632(auVar311));
  fVar66 = auVar311._0_4_;
  fVar88 = auVar311._4_4_;
  auVar22._4_4_ = fVar208 * fVar88;
  auVar22._0_4_ = fVar208 * fVar66;
  fVar136 = auVar311._8_4_;
  auVar22._8_4_ = fVar208 * fVar136;
  fVar90 = auVar311._12_4_;
  auVar22._12_4_ = fVar208 * fVar90;
  auVar22._16_4_ = fVar208 * 0.0;
  auVar22._20_4_ = fVar208 * 0.0;
  auVar22._24_4_ = fVar208 * 0.0;
  auVar22._28_4_ = 0x3f800000;
  auVar311 = vfmadd231ps_fma(auVar22,auVar85,auVar306);
  fVar116 = auVar256._0_4_;
  fVar117 = auVar256._4_4_;
  auVar23._4_4_ = fVar117 * fVar88;
  auVar23._0_4_ = fVar116 * fVar66;
  auVar23._8_4_ = fVar116 * fVar136;
  auVar23._12_4_ = fVar117 * fVar90;
  auVar23._16_4_ = fVar116 * 0.0;
  auVar23._20_4_ = fVar117 * 0.0;
  auVar23._24_4_ = fVar116 * 0.0;
  auVar23._28_4_ = uVar59;
  auVar317 = vfmadd231ps_fma(auVar23,auVar85,auVar299);
  auVar24._4_4_ = fVar119 * fVar88;
  auVar24._0_4_ = fVar119 * fVar66;
  auVar24._8_4_ = fVar119 * fVar136;
  auVar24._12_4_ = fVar119 * fVar90;
  auVar24._16_4_ = fVar119 * 0.0;
  auVar24._20_4_ = fVar119 * 0.0;
  auVar24._24_4_ = fVar119 * 0.0;
  auVar24._28_4_ = auVar243._4_4_;
  auVar146 = vfmadd231ps_fma(auVar24,auVar85,auVar286);
  fVar116 = auVar257._0_4_;
  fVar117 = auVar257._4_4_;
  auVar14._4_4_ = fVar117 * fVar88;
  auVar14._0_4_ = fVar116 * fVar66;
  auVar14._8_4_ = fVar116 * fVar136;
  auVar14._12_4_ = fVar117 * fVar90;
  auVar14._16_4_ = fVar116 * 0.0;
  auVar14._20_4_ = fVar117 * 0.0;
  auVar14._24_4_ = fVar116 * 0.0;
  auVar14._28_4_ = fVar208;
  auVar69 = vfmadd231ps_fma(auVar14,auVar85,auVar113);
  auVar243 = vshufps_avx(auVar281,auVar281,0xaa);
  local_578._8_8_ = auVar243._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar256 = vshufps_avx(auVar281,auVar281,0xff);
  uStack_640 = auVar256._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar25._4_4_ = fVar118 * fVar88;
  auVar25._0_4_ = fVar118 * fVar66;
  auVar25._8_4_ = fVar118 * fVar136;
  auVar25._12_4_ = fVar118 * fVar90;
  auVar25._16_4_ = fVar118 * 0.0;
  auVar25._20_4_ = fVar118 * 0.0;
  auVar25._24_4_ = fVar118 * 0.0;
  auVar25._28_4_ = fVar118;
  auVar281 = vfmadd231ps_fma(auVar25,auVar85,auVar220);
  auVar256 = vshufps_avx(auVar177,auVar177,0xaa);
  auVar221._0_8_ = auVar256._0_8_;
  auVar221._8_8_ = auVar221._0_8_;
  auVar221._16_8_ = auVar221._0_8_;
  auVar221._24_8_ = auVar221._0_8_;
  auVar257 = vshufps_avx(auVar177,auVar177,0xff);
  uStack_520 = auVar257._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  fVar116 = auVar258._0_4_;
  fVar117 = auVar258._4_4_;
  auVar26._4_4_ = fVar117 * fVar88;
  auVar26._0_4_ = fVar116 * fVar66;
  auVar26._8_4_ = fVar116 * fVar136;
  auVar26._12_4_ = fVar117 * fVar90;
  auVar26._16_4_ = fVar116 * 0.0;
  auVar26._20_4_ = fVar117 * 0.0;
  auVar26._24_4_ = fVar116 * 0.0;
  auVar26._28_4_ = auVar243._4_4_;
  auVar70 = vfmadd231ps_fma(auVar26,auVar85,auVar240);
  auVar27._28_4_ = fVar117;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar146._12_4_ * fVar90,
                          CONCAT48(auVar146._8_4_ * fVar136,
                                   CONCAT44(auVar146._4_4_ * fVar88,auVar146._0_4_ * fVar66))));
  auVar311 = vfmadd231ps_fma(auVar27,auVar85,ZEXT1632(auVar311));
  fVar116 = auVar257._4_4_;
  auVar28._28_4_ = fVar116;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar69._12_4_ * fVar90,
                          CONCAT48(auVar69._8_4_ * fVar136,
                                   CONCAT44(auVar69._4_4_ * fVar88,auVar69._0_4_ * fVar66))));
  auVar317 = vfmadd231ps_fma(auVar28,auVar85,ZEXT1632(auVar317));
  auVar243 = vshufps_avx(auVar289,auVar289,0xaa);
  uVar91 = auVar243._0_8_;
  auVar205._8_8_ = uVar91;
  auVar205._0_8_ = uVar91;
  auVar205._16_8_ = uVar91;
  auVar205._24_8_ = uVar91;
  auVar258 = vshufps_avx(auVar289,auVar289,0xff);
  uVar91 = auVar258._0_8_;
  auVar321._8_8_ = uVar91;
  auVar321._0_8_ = uVar91;
  auVar321._16_8_ = uVar91;
  auVar321._24_8_ = uVar91;
  auVar289 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar281._12_4_ * fVar90,
                                                CONCAT48(auVar281._8_4_ * fVar136,
                                                         CONCAT44(auVar281._4_4_ * fVar88,
                                                                  auVar281._0_4_ * fVar66)))),
                             auVar85,ZEXT1632(auVar146));
  auVar281 = vshufps_avx(auVar273,auVar273,0xaa);
  auVar177 = vshufps_avx(auVar273,auVar273,0xff);
  auVar273 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar70._12_4_,
                                                CONCAT48(fVar136 * auVar70._8_4_,
                                                         CONCAT44(fVar88 * auVar70._4_4_,
                                                                  fVar66 * auVar70._0_4_)))),auVar85
                             ,ZEXT1632(auVar69));
  auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar289._12_4_,
                                                CONCAT48(fVar136 * auVar289._8_4_,
                                                         CONCAT44(fVar88 * auVar289._4_4_,
                                                                  fVar66 * auVar289._0_4_)))),
                             auVar85,ZEXT1632(auVar311));
  auVar22 = vsubps_avx(ZEXT1632(auVar289),ZEXT1632(auVar311));
  auVar289 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar273._12_4_,
                                                CONCAT48(fVar136 * auVar273._8_4_,
                                                         CONCAT44(fVar88 * auVar273._4_4_,
                                                                  fVar66 * auVar273._0_4_)))),
                             auVar85,ZEXT1632(auVar317));
  auVar23 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar317));
  fStack_4ec = auVar23._28_4_;
  auVar287._0_4_ = fStack_120 * auVar22._0_4_ * 3.0;
  auVar287._4_4_ = fStack_120 * auVar22._4_4_ * 3.0;
  auVar287._8_4_ = fStack_120 * auVar22._8_4_ * 3.0;
  auVar287._12_4_ = fStack_120 * auVar22._12_4_ * 3.0;
  auVar287._16_4_ = fStack_120 * auVar22._16_4_ * 3.0;
  auVar287._20_4_ = fStack_120 * auVar22._20_4_ * 3.0;
  auVar287._24_4_ = fStack_120 * auVar22._24_4_ * 3.0;
  auVar287._28_4_ = 0;
  local_508._0_4_ = fStack_120 * auVar23._0_4_ * 3.0;
  local_508._4_4_ = fStack_120 * auVar23._4_4_ * 3.0;
  fStack_500 = fStack_120 * auVar23._8_4_ * 3.0;
  fStack_4fc = fStack_120 * auVar23._12_4_ * 3.0;
  fStack_4f8 = fStack_120 * auVar23._16_4_ * 3.0;
  fStack_4f4 = fStack_120 * auVar23._20_4_ * 3.0;
  fStack_4f0 = fStack_120 * auVar23._24_4_ * 3.0;
  fVar117 = auVar256._0_4_;
  fVar118 = auVar256._4_4_;
  auVar29._4_4_ = fVar118 * fVar88;
  auVar29._0_4_ = fVar117 * fVar66;
  auVar29._8_4_ = fVar117 * fVar136;
  auVar29._12_4_ = fVar118 * fVar90;
  auVar29._16_4_ = fVar117 * 0.0;
  auVar29._20_4_ = fVar118 * 0.0;
  auVar29._24_4_ = fVar117 * 0.0;
  auVar29._28_4_ = fStack_4ec;
  auVar256 = vfmadd231ps_fma(auVar29,auVar85,local_578);
  fVar117 = auVar257._0_4_;
  auVar241._4_4_ = fVar116 * fVar88;
  auVar241._0_4_ = fVar117 * fVar66;
  auVar241._8_4_ = fVar117 * fVar136;
  auVar241._12_4_ = fVar116 * fVar90;
  auVar241._16_4_ = fVar117 * 0.0;
  auVar241._20_4_ = fVar116 * 0.0;
  auVar241._24_4_ = fVar117 * 0.0;
  auVar241._28_4_ = 0;
  auVar257 = vfmadd231ps_fma(auVar241,auVar85,_local_648);
  fVar116 = auVar243._0_4_;
  fVar117 = auVar243._4_4_;
  auVar288._4_4_ = fVar117 * fVar88;
  auVar288._0_4_ = fVar116 * fVar66;
  auVar288._8_4_ = fVar116 * fVar136;
  auVar288._12_4_ = fVar117 * fVar90;
  auVar288._16_4_ = fVar116 * 0.0;
  auVar288._20_4_ = fVar117 * 0.0;
  auVar288._24_4_ = fVar116 * 0.0;
  auVar288._28_4_ = auVar22._28_4_;
  auVar243 = vfmadd231ps_fma(auVar288,auVar85,auVar221);
  fVar116 = auVar258._0_4_;
  fVar119 = auVar258._4_4_;
  auVar31._4_4_ = fVar119 * fVar88;
  auVar31._0_4_ = fVar116 * fVar66;
  auVar31._8_4_ = fVar116 * fVar136;
  auVar31._12_4_ = fVar119 * fVar90;
  auVar31._16_4_ = fVar116 * 0.0;
  auVar31._20_4_ = fVar119 * 0.0;
  auVar31._24_4_ = fVar116 * 0.0;
  auVar31._28_4_ = fVar118;
  auVar258 = vfmadd231ps_fma(auVar31,auVar85,_local_528);
  auVar25 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar146));
  fVar116 = auVar281._0_4_;
  fVar117 = auVar281._4_4_;
  auVar32._4_4_ = fVar117 * fVar88;
  auVar32._0_4_ = fVar116 * fVar66;
  auVar32._8_4_ = fVar116 * fVar136;
  auVar32._12_4_ = fVar117 * fVar90;
  auVar32._16_4_ = fVar116 * 0.0;
  auVar32._20_4_ = fVar117 * 0.0;
  auVar32._24_4_ = fVar116 * 0.0;
  auVar32._28_4_ = fVar117;
  auVar281 = vfmadd231ps_fma(auVar32,auVar85,auVar205);
  auVar26 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar289));
  fVar116 = auVar177._0_4_;
  fVar117 = auVar177._4_4_;
  auVar33._4_4_ = fVar117 * fVar88;
  auVar33._0_4_ = fVar116 * fVar66;
  auVar33._8_4_ = fVar116 * fVar136;
  auVar33._12_4_ = fVar117 * fVar90;
  auVar33._16_4_ = fVar116 * 0.0;
  auVar33._20_4_ = fVar117 * 0.0;
  auVar33._24_4_ = fVar116 * 0.0;
  auVar33._28_4_ = fVar117;
  auVar177 = vfmadd231ps_fma(auVar33,auVar85,auVar321);
  auVar34._28_4_ = fVar119;
  auVar34._0_28_ =
       ZEXT1628(CONCAT412(auVar243._12_4_ * fVar90,
                          CONCAT48(auVar243._8_4_ * fVar136,
                                   CONCAT44(auVar243._4_4_ * fVar88,auVar243._0_4_ * fVar66))));
  auVar256 = vfmadd231ps_fma(auVar34,auVar85,ZEXT1632(auVar256));
  auVar257 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar258._12_4_,
                                                CONCAT48(fVar136 * auVar258._8_4_,
                                                         CONCAT44(fVar88 * auVar258._4_4_,
                                                                  fVar66 * auVar258._0_4_)))),
                             auVar85,ZEXT1632(auVar257));
  auVar114._0_4_ = auVar146._0_4_ + auVar287._0_4_;
  auVar114._4_4_ = auVar146._4_4_ + auVar287._4_4_;
  auVar114._8_4_ = auVar146._8_4_ + auVar287._8_4_;
  auVar114._12_4_ = auVar146._12_4_ + auVar287._12_4_;
  auVar114._16_4_ = auVar287._16_4_ + 0.0;
  auVar114._20_4_ = auVar287._20_4_ + 0.0;
  auVar114._24_4_ = auVar287._24_4_ + 0.0;
  auVar114._28_4_ = 0;
  auVar243 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar281._12_4_ * fVar90,
                                                CONCAT48(auVar281._8_4_ * fVar136,
                                                         CONCAT44(auVar281._4_4_ * fVar88,
                                                                  auVar281._0_4_ * fVar66)))),
                             auVar85,ZEXT1632(auVar243));
  auVar258 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar177._12_4_ * fVar90,
                                                CONCAT48(auVar177._8_4_ * fVar136,
                                                         CONCAT44(auVar177._4_4_ * fVar88,
                                                                  auVar177._0_4_ * fVar66)))),
                             auVar85,ZEXT1632(auVar258));
  auVar281 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar243._12_4_,
                                                CONCAT48(fVar136 * auVar243._8_4_,
                                                         CONCAT44(fVar88 * auVar243._4_4_,
                                                                  fVar66 * auVar243._0_4_)))),
                             auVar85,ZEXT1632(auVar256));
  auVar177 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar258._12_4_ * fVar90,
                                                CONCAT48(auVar258._8_4_ * fVar136,
                                                         CONCAT44(auVar258._4_4_ * fVar88,
                                                                  auVar258._0_4_ * fVar66)))),
                             ZEXT1632(auVar257),auVar85);
  auVar85 = vsubps_avx(ZEXT1632(auVar243),ZEXT1632(auVar256));
  auVar22 = vsubps_avx(ZEXT1632(auVar258),ZEXT1632(auVar257));
  auVar307._0_4_ = fStack_120 * auVar85._0_4_ * 3.0;
  auVar307._4_4_ = fStack_120 * auVar85._4_4_ * 3.0;
  auVar307._8_4_ = fStack_120 * auVar85._8_4_ * 3.0;
  auVar307._12_4_ = fStack_120 * auVar85._12_4_ * 3.0;
  auVar307._16_4_ = fStack_120 * auVar85._16_4_ * 3.0;
  auVar307._20_4_ = fStack_120 * auVar85._20_4_ * 3.0;
  auVar307._24_4_ = fStack_120 * auVar85._24_4_ * 3.0;
  auVar307._28_4_ = 0;
  local_138 = fStack_120 * auVar22._0_4_ * 3.0;
  fStack_134 = fStack_120 * auVar22._4_4_ * 3.0;
  auVar35._4_4_ = fStack_134;
  auVar35._0_4_ = local_138;
  fStack_130 = fStack_120 * auVar22._8_4_ * 3.0;
  auVar35._8_4_ = fStack_130;
  fStack_12c = fStack_120 * auVar22._12_4_ * 3.0;
  auVar35._12_4_ = fStack_12c;
  fStack_128 = fStack_120 * auVar22._16_4_ * 3.0;
  auVar35._16_4_ = fStack_128;
  fStack_124 = fStack_120 * auVar22._20_4_ * 3.0;
  auVar35._20_4_ = fStack_124;
  fStack_120 = fStack_120 * auVar22._24_4_ * 3.0;
  auVar35._24_4_ = fStack_120;
  auVar35._28_4_ = 0x40400000;
  auVar27 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar281));
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar177));
  auVar85 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar146));
  auVar22 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar289));
  auVar23 = vsubps_avx(auVar27,auVar25);
  fVar208 = auVar85._0_4_ + auVar23._0_4_;
  fVar224 = auVar85._4_4_ + auVar23._4_4_;
  fVar225 = auVar85._8_4_ + auVar23._8_4_;
  fVar226 = auVar85._12_4_ + auVar23._12_4_;
  fVar227 = auVar85._16_4_ + auVar23._16_4_;
  fVar228 = auVar85._20_4_ + auVar23._20_4_;
  fVar229 = auVar85._24_4_ + auVar23._24_4_;
  auVar24 = vsubps_avx(auVar28,auVar26);
  auVar86._0_4_ = auVar22._0_4_ + auVar24._0_4_;
  auVar86._4_4_ = auVar22._4_4_ + auVar24._4_4_;
  auVar86._8_4_ = auVar22._8_4_ + auVar24._8_4_;
  auVar86._12_4_ = auVar22._12_4_ + auVar24._12_4_;
  auVar86._16_4_ = auVar22._16_4_ + auVar24._16_4_;
  auVar86._20_4_ = auVar22._20_4_ + auVar24._20_4_;
  auVar86._24_4_ = auVar22._24_4_ + auVar24._24_4_;
  auVar86._28_4_ = auVar22._28_4_ + auVar24._28_4_;
  local_d8 = ZEXT1632(auVar289);
  fVar66 = auVar289._0_4_;
  local_158 = (float)local_508._0_4_ + fVar66;
  fVar88 = auVar289._4_4_;
  fStack_154 = (float)local_508._4_4_ + fVar88;
  fVar136 = auVar289._8_4_;
  fStack_150 = fStack_500 + fVar136;
  fVar90 = auVar289._12_4_;
  fStack_14c = fStack_4fc + fVar90;
  fStack_148 = fStack_4f8 + 0.0;
  fStack_144 = fStack_4f4 + 0.0;
  fStack_140 = fStack_4f0 + 0.0;
  auVar241 = ZEXT1632(auVar146);
  auVar22 = vsubps_avx(auVar241,auVar287);
  local_b8 = vpermps_avx2(_DAT_01fb7720,auVar22);
  auVar22 = vsubps_avx(local_d8,_local_508);
  local_178 = vpermps_avx2(_DAT_01fb7720,auVar22);
  local_f8._0_4_ = auVar281._0_4_ + auVar307._0_4_;
  local_f8._4_4_ = auVar281._4_4_ + auVar307._4_4_;
  local_f8._8_4_ = auVar281._8_4_ + auVar307._8_4_;
  local_f8._12_4_ = auVar281._12_4_ + auVar307._12_4_;
  local_f8._16_4_ = auVar307._16_4_ + 0.0;
  local_f8._20_4_ = auVar307._20_4_ + 0.0;
  local_f8._24_4_ = auVar307._24_4_ + 0.0;
  local_f8._28_4_ = 0;
  auVar288 = ZEXT1632(auVar281);
  auVar22 = vsubps_avx(auVar288,auVar307);
  auVar29 = vpermps_avx2(_DAT_01fb7720,auVar22);
  fVar116 = auVar177._0_4_;
  local_138 = fVar116 + local_138;
  fVar117 = auVar177._4_4_;
  fStack_134 = fVar117 + fStack_134;
  fVar118 = auVar177._8_4_;
  fStack_130 = fVar118 + fStack_130;
  fVar119 = auVar177._12_4_;
  fStack_12c = fVar119 + fStack_12c;
  fStack_128 = fStack_128 + 0.0;
  fStack_124 = fStack_124 + 0.0;
  fStack_120 = fStack_120 + 0.0;
  auVar22 = vsubps_avx(ZEXT1632(auVar177),auVar35);
  local_118 = vpermps_avx2(_DAT_01fb7720,auVar22);
  auVar36._4_4_ = fVar88 * fVar224;
  auVar36._0_4_ = fVar66 * fVar208;
  auVar36._8_4_ = fVar136 * fVar225;
  auVar36._12_4_ = fVar90 * fVar226;
  auVar36._16_4_ = fVar227 * 0.0;
  auVar36._20_4_ = fVar228 * 0.0;
  auVar36._24_4_ = fVar229 * 0.0;
  auVar36._28_4_ = auVar22._28_4_;
  auVar243 = vfnmadd231ps_fma(auVar36,auVar241,auVar86);
  fStack_13c = fStack_4ec + 0.0;
  auVar37._4_4_ = fStack_154 * fVar224;
  auVar37._0_4_ = local_158 * fVar208;
  auVar37._8_4_ = fStack_150 * fVar225;
  auVar37._12_4_ = fStack_14c * fVar226;
  auVar37._16_4_ = fStack_148 * fVar227;
  auVar37._20_4_ = fStack_144 * fVar228;
  auVar37._24_4_ = fStack_140 * fVar229;
  auVar37._28_4_ = 0;
  auVar256 = vfnmadd231ps_fma(auVar37,auVar86,auVar114);
  auVar38._4_4_ = local_178._4_4_ * fVar224;
  auVar38._0_4_ = local_178._0_4_ * fVar208;
  auVar38._8_4_ = local_178._8_4_ * fVar225;
  auVar38._12_4_ = local_178._12_4_ * fVar226;
  auVar38._16_4_ = local_178._16_4_ * fVar227;
  auVar38._20_4_ = local_178._20_4_ * fVar228;
  auVar38._24_4_ = local_178._24_4_ * fVar229;
  auVar38._28_4_ = fStack_4ec + 0.0;
  auVar257 = vfnmadd231ps_fma(auVar38,local_b8,auVar86);
  local_648._0_4_ = auVar26._0_4_;
  local_648._4_4_ = auVar26._4_4_;
  uStack_640._0_4_ = auVar26._8_4_;
  uStack_640._4_4_ = auVar26._12_4_;
  uStack_638._0_4_ = auVar26._16_4_;
  uStack_638._4_4_ = auVar26._20_4_;
  uStack_630._0_4_ = auVar26._24_4_;
  uStack_630._4_4_ = auVar26._28_4_;
  auVar39._4_4_ = (float)local_648._4_4_ * fVar224;
  auVar39._0_4_ = (float)local_648._0_4_ * fVar208;
  auVar39._8_4_ = (float)uStack_640 * fVar225;
  auVar39._12_4_ = uStack_640._4_4_ * fVar226;
  auVar39._16_4_ = (float)uStack_638 * fVar227;
  auVar39._20_4_ = uStack_638._4_4_ * fVar228;
  auVar39._24_4_ = (float)uStack_630 * fVar229;
  auVar39._28_4_ = uStack_630._4_4_;
  auVar258 = vfnmadd231ps_fma(auVar39,auVar25,auVar86);
  auVar242._0_4_ = fVar116 * fVar208;
  auVar242._4_4_ = fVar117 * fVar224;
  auVar242._8_4_ = fVar118 * fVar225;
  auVar242._12_4_ = fVar119 * fVar226;
  auVar242._16_4_ = fVar227 * 0.0;
  auVar242._20_4_ = fVar228 * 0.0;
  auVar242._24_4_ = fVar229 * 0.0;
  auVar242._28_4_ = 0;
  auVar281 = vfnmadd231ps_fma(auVar242,auVar288,auVar86);
  uStack_11c = 0x40400000;
  auVar40._4_4_ = fStack_134 * fVar224;
  auVar40._0_4_ = local_138 * fVar208;
  auVar40._8_4_ = fStack_130 * fVar225;
  auVar40._12_4_ = fStack_12c * fVar226;
  auVar40._16_4_ = fStack_128 * fVar227;
  auVar40._20_4_ = fStack_124 * fVar228;
  auVar40._24_4_ = fStack_120 * fVar229;
  auVar40._28_4_ = auVar25._28_4_;
  auVar289 = vfnmadd231ps_fma(auVar40,local_f8,auVar86);
  auVar41._4_4_ = local_118._4_4_ * fVar224;
  auVar41._0_4_ = local_118._0_4_ * fVar208;
  auVar41._8_4_ = local_118._8_4_ * fVar225;
  auVar41._12_4_ = local_118._12_4_ * fVar226;
  auVar41._16_4_ = local_118._16_4_ * fVar227;
  auVar41._20_4_ = local_118._20_4_ * fVar228;
  auVar41._24_4_ = local_118._24_4_ * fVar229;
  auVar41._28_4_ = local_118._28_4_;
  auVar273 = vfnmadd231ps_fma(auVar41,auVar29,auVar86);
  auVar42._4_4_ = auVar28._4_4_ * fVar224;
  auVar42._0_4_ = auVar28._0_4_ * fVar208;
  auVar42._8_4_ = auVar28._8_4_ * fVar225;
  auVar42._12_4_ = auVar28._12_4_ * fVar226;
  auVar42._16_4_ = auVar28._16_4_ * fVar227;
  auVar42._20_4_ = auVar28._20_4_ * fVar228;
  auVar42._24_4_ = auVar28._24_4_ * fVar229;
  auVar42._28_4_ = auVar85._28_4_ + auVar23._28_4_;
  auVar311 = vfnmadd231ps_fma(auVar42,auVar27,auVar86);
  auVar22 = vminps_avx(ZEXT1632(auVar243),ZEXT1632(auVar256));
  auVar85 = vmaxps_avx(ZEXT1632(auVar243),ZEXT1632(auVar256));
  auVar23 = vminps_avx(ZEXT1632(auVar257),ZEXT1632(auVar258));
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(ZEXT1632(auVar257),ZEXT1632(auVar258));
  auVar85 = vmaxps_avx(auVar85,auVar22);
  auVar24 = vminps_avx(ZEXT1632(auVar281),ZEXT1632(auVar289));
  auVar22 = vmaxps_avx(ZEXT1632(auVar281),ZEXT1632(auVar289));
  auVar14 = vminps_avx(ZEXT1632(auVar273),ZEXT1632(auVar311));
  auVar24 = vminps_avx(auVar24,auVar14);
  auVar24 = vminps_avx(auVar23,auVar24);
  auVar23 = vmaxps_avx(ZEXT1632(auVar273),ZEXT1632(auVar311));
  auVar22 = vmaxps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(auVar85,auVar22);
  auVar51._4_4_ = fStack_74;
  auVar51._0_4_ = local_78;
  auVar51._8_4_ = fStack_70;
  auVar51._12_4_ = fStack_6c;
  auVar51._16_4_ = fStack_68;
  auVar51._20_4_ = fStack_64;
  auVar51._24_4_ = fStack_60;
  auVar51._28_4_ = fStack_5c;
  auVar85 = vcmpps_avx(auVar24,auVar51,2);
  auVar50._4_4_ = fStack_94;
  auVar50._0_4_ = local_98;
  auVar50._8_4_ = fStack_90;
  auVar50._12_4_ = fStack_8c;
  auVar50._16_4_ = fStack_88;
  auVar50._20_4_ = fStack_84;
  auVar50._24_4_ = fStack_80;
  auVar50._28_4_ = fStack_7c;
  auVar22 = vcmpps_avx(auVar22,auVar50,5);
  auVar85 = vandps_avx(auVar22,auVar85);
  auVar22 = local_198 & auVar85;
  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0x7f,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar22 >> 0xbf,0) != '\0') ||
      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0') {
    auVar22 = vsubps_avx(auVar25,auVar241);
    auVar23 = vsubps_avx(auVar27,auVar288);
    fVar224 = auVar22._0_4_ + auVar23._0_4_;
    fVar225 = auVar22._4_4_ + auVar23._4_4_;
    fVar226 = auVar22._8_4_ + auVar23._8_4_;
    fVar227 = auVar22._12_4_ + auVar23._12_4_;
    fVar228 = auVar22._16_4_ + auVar23._16_4_;
    fVar229 = auVar22._20_4_ + auVar23._20_4_;
    fVar89 = auVar22._24_4_ + auVar23._24_4_;
    auVar24 = vsubps_avx(auVar26,local_d8);
    auVar14 = vsubps_avx(auVar28,ZEXT1632(auVar177));
    auVar115._0_4_ = auVar24._0_4_ + auVar14._0_4_;
    auVar115._4_4_ = auVar24._4_4_ + auVar14._4_4_;
    auVar115._8_4_ = auVar24._8_4_ + auVar14._8_4_;
    auVar115._12_4_ = auVar24._12_4_ + auVar14._12_4_;
    auVar115._16_4_ = auVar24._16_4_ + auVar14._16_4_;
    auVar115._20_4_ = auVar24._20_4_ + auVar14._20_4_;
    auVar115._24_4_ = auVar24._24_4_ + auVar14._24_4_;
    fVar208 = auVar14._28_4_;
    auVar115._28_4_ = auVar24._28_4_ + fVar208;
    auVar43._4_4_ = fVar88 * fVar225;
    auVar43._0_4_ = fVar66 * fVar224;
    auVar43._8_4_ = fVar136 * fVar226;
    auVar43._12_4_ = fVar90 * fVar227;
    auVar43._16_4_ = fVar228 * 0.0;
    auVar43._20_4_ = fVar229 * 0.0;
    auVar43._24_4_ = fVar89 * 0.0;
    auVar43._28_4_ = auVar28._28_4_;
    auVar281 = vfnmadd231ps_fma(auVar43,auVar115,auVar241);
    auVar44._4_4_ = fVar225 * fStack_154;
    auVar44._0_4_ = fVar224 * local_158;
    auVar44._8_4_ = fVar226 * fStack_150;
    auVar44._12_4_ = fVar227 * fStack_14c;
    auVar44._16_4_ = fVar228 * fStack_148;
    auVar44._20_4_ = fVar229 * fStack_144;
    auVar44._24_4_ = fVar89 * fStack_140;
    auVar44._28_4_ = 0;
    auVar243 = vfnmadd213ps_fma(auVar114,auVar115,auVar44);
    auVar45._4_4_ = fVar225 * local_178._4_4_;
    auVar45._0_4_ = fVar224 * local_178._0_4_;
    auVar45._8_4_ = fVar226 * local_178._8_4_;
    auVar45._12_4_ = fVar227 * local_178._12_4_;
    auVar45._16_4_ = fVar228 * local_178._16_4_;
    auVar45._20_4_ = fVar229 * local_178._20_4_;
    auVar45._24_4_ = fVar89 * local_178._24_4_;
    auVar45._28_4_ = 0;
    auVar256 = vfnmadd213ps_fma(local_b8,auVar115,auVar45);
    auVar46._4_4_ = (float)local_648._4_4_ * fVar225;
    auVar46._0_4_ = (float)local_648._0_4_ * fVar224;
    auVar46._8_4_ = (float)uStack_640 * fVar226;
    auVar46._12_4_ = uStack_640._4_4_ * fVar227;
    auVar46._16_4_ = (float)uStack_638 * fVar228;
    auVar46._20_4_ = uStack_638._4_4_ * fVar229;
    auVar46._24_4_ = (float)uStack_630 * fVar89;
    auVar46._28_4_ = 0;
    auVar177 = vfnmadd231ps_fma(auVar46,auVar115,auVar25);
    auVar152._0_4_ = fVar116 * fVar224;
    auVar152._4_4_ = fVar117 * fVar225;
    auVar152._8_4_ = fVar118 * fVar226;
    auVar152._12_4_ = fVar119 * fVar227;
    auVar152._16_4_ = fVar228 * 0.0;
    auVar152._20_4_ = fVar229 * 0.0;
    auVar152._24_4_ = fVar89 * 0.0;
    auVar152._28_4_ = 0;
    auVar289 = vfnmadd231ps_fma(auVar152,auVar115,auVar288);
    auVar47._4_4_ = fVar225 * fStack_134;
    auVar47._0_4_ = fVar224 * local_138;
    auVar47._8_4_ = fVar226 * fStack_130;
    auVar47._12_4_ = fVar227 * fStack_12c;
    auVar47._16_4_ = fVar228 * fStack_128;
    auVar47._20_4_ = fVar229 * fStack_124;
    auVar47._24_4_ = fVar89 * fStack_120;
    auVar47._28_4_ = fVar208;
    auVar257 = vfnmadd213ps_fma(local_f8,auVar115,auVar47);
    auVar48._4_4_ = fVar225 * local_118._4_4_;
    auVar48._0_4_ = fVar224 * local_118._0_4_;
    auVar48._8_4_ = fVar226 * local_118._8_4_;
    auVar48._12_4_ = fVar227 * local_118._12_4_;
    auVar48._16_4_ = fVar228 * local_118._16_4_;
    auVar48._20_4_ = fVar229 * local_118._20_4_;
    auVar48._24_4_ = fVar89 * local_118._24_4_;
    auVar48._28_4_ = fVar208;
    auVar258 = vfnmadd213ps_fma(auVar29,auVar115,auVar48);
    auVar49._4_4_ = fVar225 * auVar28._4_4_;
    auVar49._0_4_ = fVar224 * auVar28._0_4_;
    auVar49._8_4_ = fVar226 * auVar28._8_4_;
    auVar49._12_4_ = fVar227 * auVar28._12_4_;
    auVar49._16_4_ = fVar228 * auVar28._16_4_;
    auVar49._20_4_ = fVar229 * auVar28._20_4_;
    auVar49._24_4_ = fVar89 * auVar28._24_4_;
    auVar49._28_4_ = auVar22._28_4_ + auVar23._28_4_;
    auVar273 = vfnmadd231ps_fma(auVar49,auVar115,auVar27);
    auVar23 = vminps_avx(ZEXT1632(auVar281),ZEXT1632(auVar243));
    auVar22 = vmaxps_avx(ZEXT1632(auVar281),ZEXT1632(auVar243));
    auVar24 = vminps_avx(ZEXT1632(auVar256),ZEXT1632(auVar177));
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar256),ZEXT1632(auVar177));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar14 = vminps_avx(ZEXT1632(auVar289),ZEXT1632(auVar257));
    auVar23 = vmaxps_avx(ZEXT1632(auVar289),ZEXT1632(auVar257));
    auVar25 = vminps_avx(ZEXT1632(auVar258),ZEXT1632(auVar273));
    auVar14 = vminps_avx(auVar14,auVar25);
    auVar14 = vminps_avx(auVar24,auVar14);
    auVar24 = vmaxps_avx(ZEXT1632(auVar258),ZEXT1632(auVar273));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vcmpps_avx(auVar14,auVar51,2);
    auVar23 = vcmpps_avx(auVar23,auVar50,5);
    auVar22 = vandps_avx(auVar23,auVar22);
    auVar85 = vandps_avx(auVar85,local_198);
    auVar23 = auVar85 & auVar22;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar85 = vandps_avx(auVar22,auVar85);
      uVar56 = vmovmskps_avx(auVar85);
      if (uVar56 != 0) {
        mask_stack[uVar57] = uVar56 & 0xff;
        BVar3 = (BBox1f)vmovlps_avx(auVar13);
        cu_stack[uVar57] = BVar3;
        BVar3 = (BBox1f)vmovlps_avx(auVar72);
        cv_stack[uVar57] = BVar3;
        uVar57 = (ulong)((int)uVar57 + 1);
      }
    }
  }
LAB_01210878:
  if ((int)uVar57 != 0) {
    uVar52 = (int)uVar57 - 1;
    uVar56 = mask_stack[uVar52];
    fVar66 = cu_stack[uVar52].lower;
    fVar88 = cu_stack[uVar52].upper;
    iVar30 = 0;
    for (uVar58 = (ulong)uVar56; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      iVar30 = iVar30 + 1;
    }
    uVar56 = uVar56 - 1 & uVar56;
    if (uVar56 == 0) {
      uVar57 = (ulong)uVar52;
    }
    auVar72._8_8_ = 0;
    auVar72._0_4_ = cv_stack[uVar52].lower;
    auVar72._4_4_ = cv_stack[uVar52].upper;
    mask_stack[uVar52] = uVar56;
    fVar136 = (float)(iVar30 + 1) * 0.14285715;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * (float)iVar30 * 0.14285715)),
                              ZEXT416((uint)fVar66),
                              ZEXT416((uint)(1.0 - (float)iVar30 * 0.14285715)));
    auVar243 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * fVar136)),ZEXT416((uint)fVar66),
                               ZEXT416((uint)(1.0 - fVar136)));
    fVar88 = auVar243._0_4_;
    auVar222._0_4_ = auVar13._0_4_;
    fVar66 = fVar88 - auVar222._0_4_;
    if (fVar66 < 0.16666667) {
      auVar256 = vshufps_avx(auVar72,auVar72,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar257 = vsubps_avx(auVar101,auVar256);
      fVar136 = auVar256._0_4_;
      auVar163._0_4_ = fVar136 * fVar133;
      fVar90 = auVar256._4_4_;
      auVar163._4_4_ = fVar90 * fVar134;
      fVar116 = auVar256._8_4_;
      auVar163._8_4_ = fVar116 * fVar133;
      fVar117 = auVar256._12_4_;
      auVar163._12_4_ = fVar117 * fVar134;
      auVar175._0_4_ = fVar136 * fVar186;
      auVar175._4_4_ = fVar90 * fVar206;
      auVar175._8_4_ = fVar116 * fVar186;
      auVar175._12_4_ = fVar117 * fVar206;
      auVar202._0_4_ = fVar136 * fVar207;
      auVar202._4_4_ = fVar90 * fVar223;
      auVar202._8_4_ = fVar116 * fVar207;
      auVar202._12_4_ = fVar117 * fVar223;
      auVar74._0_4_ = fVar136 * fVar135;
      auVar74._4_4_ = fVar90 * fVar185;
      auVar74._8_4_ = fVar116 * fVar135;
      auVar74._12_4_ = fVar117 * fVar185;
      auVar256 = vfmadd231ps_fma(auVar163,auVar257,auVar234);
      auVar258 = vfmadd231ps_fma(auVar175,auVar257,auVar261);
      auVar281 = vfmadd231ps_fma(auVar202,auVar257,auVar293);
      auVar257 = vfmadd231ps_fma(auVar74,auVar257,auVar302);
      auVar153._16_16_ = auVar256;
      auVar153._0_16_ = auVar256;
      auVar168._16_16_ = auVar258;
      auVar168._0_16_ = auVar258;
      auVar184._16_16_ = auVar281;
      auVar184._0_16_ = auVar281;
      auVar222._4_4_ = auVar222._0_4_;
      auVar222._8_4_ = auVar222._0_4_;
      auVar222._12_4_ = auVar222._0_4_;
      auVar222._20_4_ = fVar88;
      auVar222._16_4_ = fVar88;
      auVar222._24_4_ = fVar88;
      auVar222._28_4_ = fVar88;
      auVar85 = vsubps_avx(auVar168,auVar153);
      auVar258 = vfmadd213ps_fma(auVar85,auVar222,auVar153);
      auVar85 = vsubps_avx(auVar184,auVar168);
      auVar177 = vfmadd213ps_fma(auVar85,auVar222,auVar168);
      auVar256 = vsubps_avx(auVar257,auVar281);
      auVar87._16_16_ = auVar256;
      auVar87._0_16_ = auVar256;
      auVar256 = vfmadd213ps_fma(auVar87,auVar222,auVar184);
      auVar85 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar258));
      auVar257 = vfmadd213ps_fma(auVar85,auVar222,ZEXT1632(auVar258));
      auVar85 = vsubps_avx(ZEXT1632(auVar256),ZEXT1632(auVar177));
      auVar256 = vfmadd213ps_fma(auVar85,auVar222,ZEXT1632(auVar177));
      auVar85 = vsubps_avx(ZEXT1632(auVar256),ZEXT1632(auVar257));
      auVar311 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar85,auVar222);
      fVar136 = fVar66 * 0.33333334;
      auVar102._0_8_ =
           CONCAT44(auVar311._4_4_ + fVar136 * auVar85._4_4_ * 3.0,
                    auVar311._0_4_ + fVar136 * auVar85._0_4_ * 3.0);
      auVar102._8_4_ = auVar311._8_4_ + fVar136 * auVar85._8_4_ * 3.0;
      auVar102._12_4_ = auVar311._12_4_ + fVar136 * auVar85._12_4_ * 3.0;
      auVar257 = vshufpd_avx(auVar311,auVar311,3);
      auVar258 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar256 = vsubps_avx(auVar257,auVar311);
      auVar281 = vsubps_avx(auVar258,(undefined1  [16])0x0);
      auVar75._0_4_ = auVar256._0_4_ + auVar281._0_4_;
      auVar75._4_4_ = auVar256._4_4_ + auVar281._4_4_;
      auVar75._8_4_ = auVar256._8_4_ + auVar281._8_4_;
      auVar75._12_4_ = auVar256._12_4_ + auVar281._12_4_;
      auVar256 = vshufps_avx(auVar311,auVar311,0xb1);
      auVar281 = vshufps_avx(auVar102,auVar102,0xb1);
      auVar303._4_4_ = auVar75._0_4_;
      auVar303._0_4_ = auVar75._0_4_;
      auVar303._8_4_ = auVar75._0_4_;
      auVar303._12_4_ = auVar75._0_4_;
      auVar177 = vshufps_avx(auVar75,auVar75,0x55);
      fVar90 = auVar177._0_4_;
      auVar76._0_4_ = fVar90 * auVar256._0_4_;
      fVar116 = auVar177._4_4_;
      auVar76._4_4_ = fVar116 * auVar256._4_4_;
      fVar117 = auVar177._8_4_;
      auVar76._8_4_ = fVar117 * auVar256._8_4_;
      fVar118 = auVar177._12_4_;
      auVar76._12_4_ = fVar118 * auVar256._12_4_;
      auVar176._0_4_ = fVar90 * auVar281._0_4_;
      auVar176._4_4_ = fVar116 * auVar281._4_4_;
      auVar176._8_4_ = fVar117 * auVar281._8_4_;
      auVar176._12_4_ = fVar118 * auVar281._12_4_;
      auVar289 = vfmadd231ps_fma(auVar76,auVar303,auVar311);
      auVar273 = vfmadd231ps_fma(auVar176,auVar303,auVar102);
      auVar281 = vshufps_avx(auVar289,auVar289,0xe8);
      auVar177 = vshufps_avx(auVar273,auVar273,0xe8);
      auVar256 = vcmpps_avx(auVar281,auVar177,1);
      uVar56 = vextractps_avx(auVar256,0);
      auVar317 = auVar273;
      if ((uVar56 & 1) == 0) {
        auVar317 = auVar289;
      }
      auVar145._0_4_ = fVar136 * auVar85._16_4_ * 3.0;
      auVar145._4_4_ = fVar136 * auVar85._20_4_ * 3.0;
      auVar145._8_4_ = fVar136 * auVar85._24_4_ * 3.0;
      auVar145._12_4_ = fVar136 * 0.0;
      auVar71 = vsubps_avx((undefined1  [16])0x0,auVar145);
      auVar146 = vshufps_avx(auVar71,auVar71,0xb1);
      auVar69 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._0_4_ = fVar90 * auVar146._0_4_;
      auVar218._4_4_ = fVar116 * auVar146._4_4_;
      auVar218._8_4_ = fVar117 * auVar146._8_4_;
      auVar218._12_4_ = fVar118 * auVar146._12_4_;
      auVar235._0_4_ = auVar69._0_4_ * fVar90;
      auVar235._4_4_ = auVar69._4_4_ * fVar116;
      auVar235._8_4_ = auVar69._8_4_ * fVar117;
      auVar235._12_4_ = auVar69._12_4_ * fVar118;
      auVar95 = vfmadd231ps_fma(auVar218,auVar303,auVar71);
      auVar96 = vfmadd231ps_fma(auVar235,(undefined1  [16])0x0,auVar303);
      auVar69 = vshufps_avx(auVar95,auVar95,0xe8);
      auVar70 = vshufps_avx(auVar96,auVar96,0xe8);
      auVar146 = vcmpps_avx(auVar69,auVar70,1);
      uVar56 = vextractps_avx(auVar146,0);
      auVar97 = auVar96;
      if ((uVar56 & 1) == 0) {
        auVar97 = auVar95;
      }
      auVar317 = vmaxss_avx(auVar97,auVar317);
      auVar281 = vminps_avx(auVar281,auVar177);
      auVar177 = vminps_avx(auVar69,auVar70);
      auVar177 = vminps_avx(auVar281,auVar177);
      auVar256 = vshufps_avx(auVar256,auVar256,0x55);
      auVar256 = vblendps_avx(auVar256,auVar146,2);
      auVar146 = vpslld_avx(auVar256,0x1f);
      auVar256 = vshufpd_avx(auVar273,auVar273,1);
      auVar256 = vinsertps_avx(auVar256,auVar96,0x9c);
      auVar281 = vshufpd_avx(auVar289,auVar289,1);
      auVar281 = vinsertps_avx(auVar281,auVar95,0x9c);
      auVar256 = vblendvps_avx(auVar281,auVar256,auVar146);
      auVar281 = vmovshdup_avx(auVar256);
      auVar256 = vmaxss_avx(auVar281,auVar256);
      fVar117 = auVar177._0_4_;
      auVar281 = vmovshdup_avx(auVar177);
      fVar116 = auVar256._0_4_;
      fVar136 = auVar281._0_4_;
      fVar90 = auVar317._0_4_;
      if (((0.0001 <= fVar117) || (fVar116 <= -0.0001)) && (0.0001 <= fVar136 || fVar116 <= -0.0001)
         ) goto code_r0x01210b83;
      goto LAB_01210ba9;
    }
    auVar13 = vinsertps_avx(auVar13,auVar243,0x10);
    goto LAB_012102c7;
  }
  if (bVar62) goto LAB_01211731;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar59;
  auVar84._0_4_ = uVar59;
  auVar84._8_4_ = uVar59;
  auVar84._12_4_ = uVar59;
  auVar13 = vcmpps_avx(auVar209,auVar84,2);
  uVar53 = vmovmskps_avx(auVar13);
  uVar54 = (ulong)((uint)uVar54 & (uint)uVar54 + 0xf & uVar53);
  goto LAB_0120f66d;
code_r0x01210b83:
  auVar281 = vcmpps_avx(auVar281,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar289 = vcmpps_avx(auVar177,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar281 = vandps_avx(auVar289,auVar281);
  if (fVar90 <= -0.0001 || (auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01210878;
LAB_01210ba9:
  auVar289 = vcmpps_avx(auVar177,_DAT_01f45a50,1);
  auVar273 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar281 = vcmpss_avx(auVar317,ZEXT816(0) << 0x20,1);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar124._8_4_ = 0xbf800000;
  auVar124._0_8_ = 0xbf800000bf800000;
  auVar124._12_4_ = 0xbf800000;
  auVar281 = vblendvps_avx(auVar103,auVar124,auVar281);
  auVar289 = vblendvps_avx(auVar103,auVar124,auVar289);
  fVar119 = auVar289._0_4_;
  fVar118 = auVar281._0_4_;
  auVar281 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar119 == fVar118) && (!NAN(fVar119) && !NAN(fVar118))) {
    auVar281 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar119 == fVar118) && (!NAN(fVar119) && !NAN(fVar118))) {
    auVar273 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar289 = vmovshdup_avx(auVar289);
  fVar208 = auVar289._0_4_;
  if ((fVar119 != fVar208) || (NAN(fVar119) || NAN(fVar208))) {
    if ((fVar136 != fVar117) || (NAN(fVar136) || NAN(fVar117))) {
      auVar147._0_4_ = (float)((uint)fVar117 ^ local_3f8);
      auVar147._4_4_ = auVar177._4_4_ ^ uStack_3f4;
      auVar147._8_4_ = auVar177._8_4_ ^ uStack_3f0;
      auVar147._12_4_ = auVar177._12_4_ ^ uStack_3ec;
      auVar148._0_4_ = auVar147._0_4_ / (fVar136 - fVar117);
      auVar148._4_12_ = auVar147._4_12_;
      auVar177 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar148._0_4_)),auVar148,ZEXT416(0));
      auVar289 = auVar177;
    }
    else {
      auVar177 = ZEXT816(0) << 0x20;
      if ((fVar117 != 0.0) || (auVar289 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar117))) {
        auVar177 = SUB6416(ZEXT464(0x7f800000),0);
        auVar289 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar281 = vminss_avx(auVar281,auVar177);
    auVar273 = vmaxss_avx(auVar289,auVar273);
  }
  auVar256 = vcmpss_avx(auVar256,ZEXT416(0),1);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = 0x3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar125._8_4_ = 0xbf800000;
  auVar125._0_8_ = 0xbf800000bf800000;
  auVar125._12_4_ = 0xbf800000;
  auVar256 = vblendvps_avx(auVar104,auVar125,auVar256);
  fVar136 = auVar256._0_4_;
  if ((fVar118 != fVar136) || (NAN(fVar118) || NAN(fVar136))) {
    if ((fVar116 != fVar90) || (NAN(fVar116) || NAN(fVar90))) {
      auVar77._0_4_ = (float)((uint)fVar90 ^ local_3f8);
      auVar77._4_4_ = auVar317._4_4_ ^ uStack_3f4;
      auVar77._8_4_ = auVar317._8_4_ ^ uStack_3f0;
      auVar77._12_4_ = auVar317._12_4_ ^ uStack_3ec;
      auVar149._0_4_ = auVar77._0_4_ / (fVar116 - fVar90);
      auVar149._4_12_ = auVar77._4_12_;
      auVar256 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar149._0_4_)),auVar149,ZEXT416(0));
      auVar177 = auVar256;
    }
    else {
      auVar256 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar90 != 0.0) || (auVar177 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar90))) {
        auVar256 = SUB6416(ZEXT464(0xff800000),0);
        auVar177 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar281 = vminss_avx(auVar281,auVar177);
    auVar273 = vmaxss_avx(auVar256,auVar273);
  }
  if ((fVar208 != fVar136) || (NAN(fVar208) || NAN(fVar136))) {
    auVar281 = vminss_avx(auVar281,SUB6416(ZEXT464(0x3f800000),0));
    auVar273 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar273);
  }
  auVar256 = vmaxss_avx(ZEXT816(0) << 0x40,auVar281);
  auVar281 = vminss_avx(auVar273,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar281._0_4_ < auVar256._0_4_) goto LAB_01210878;
  auVar256 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar256._0_4_ + -0.1)));
  auVar281 = vminss_avx(ZEXT416((uint)(auVar281._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar164._0_8_ = auVar311._0_8_;
  auVar164._8_8_ = auVar164._0_8_;
  auVar248._8_8_ = auVar102._0_8_;
  auVar248._0_8_ = auVar102._0_8_;
  auVar262._8_8_ = auVar71._0_8_;
  auVar262._0_8_ = auVar71._0_8_;
  auVar177 = vshufpd_avx(auVar102,auVar102,3);
  auVar289 = vshufpd_avx(auVar71,auVar71,3);
  auVar273 = vshufps_avx(auVar256,auVar281,0);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar311 = vsubps_avx(auVar78,auVar273);
  local_548 = auVar257._0_4_;
  fStack_544 = auVar257._4_4_;
  fStack_540 = auVar257._8_4_;
  fStack_53c = auVar257._12_4_;
  fVar136 = auVar273._0_4_;
  auVar79._0_4_ = fVar136 * local_548;
  fVar90 = auVar273._4_4_;
  auVar79._4_4_ = fVar90 * fStack_544;
  fVar116 = auVar273._8_4_;
  auVar79._8_4_ = fVar116 * fStack_540;
  fVar117 = auVar273._12_4_;
  auVar79._12_4_ = fVar117 * fStack_53c;
  auVar203._0_4_ = fVar136 * auVar177._0_4_;
  auVar203._4_4_ = fVar90 * auVar177._4_4_;
  auVar203._8_4_ = fVar116 * auVar177._8_4_;
  auVar203._12_4_ = fVar117 * auVar177._12_4_;
  auVar219._0_4_ = fVar136 * auVar289._0_4_;
  auVar219._4_4_ = fVar90 * auVar289._4_4_;
  auVar219._8_4_ = fVar116 * auVar289._8_4_;
  auVar219._12_4_ = fVar117 * auVar289._12_4_;
  auVar236._0_4_ = fVar136 * auVar258._0_4_;
  auVar236._4_4_ = fVar90 * auVar258._4_4_;
  auVar236._8_4_ = fVar116 * auVar258._8_4_;
  auVar236._12_4_ = fVar117 * auVar258._12_4_;
  auVar177 = vfmadd231ps_fma(auVar79,auVar311,auVar164);
  auVar289 = vfmadd231ps_fma(auVar203,auVar311,auVar248);
  auVar273 = vfmadd231ps_fma(auVar219,auVar311,auVar262);
  auVar311 = vfmadd231ps_fma(auVar236,auVar311,ZEXT816(0));
  auVar257 = vmovshdup_avx(auVar72);
  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar257._0_4_ * auVar256._0_4_)),auVar72,
                            ZEXT416((uint)(1.0 - auVar256._0_4_)));
  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar257._0_4_ * auVar281._0_4_)),auVar72,
                            ZEXT416((uint)(1.0 - auVar281._0_4_)));
  fVar136 = 1.0 / fVar66;
  auVar256 = vsubps_avx(auVar289,auVar177);
  auVar249._0_4_ = auVar256._0_4_ * 3.0;
  auVar249._4_4_ = auVar256._4_4_ * 3.0;
  auVar249._8_4_ = auVar256._8_4_ * 3.0;
  auVar249._12_4_ = auVar256._12_4_ * 3.0;
  auVar256 = vsubps_avx(auVar273,auVar289);
  auVar263._0_4_ = auVar256._0_4_ * 3.0;
  auVar263._4_4_ = auVar256._4_4_ * 3.0;
  auVar263._8_4_ = auVar256._8_4_ * 3.0;
  auVar263._12_4_ = auVar256._12_4_ * 3.0;
  auVar256 = vsubps_avx(auVar311,auVar273);
  auVar274._0_4_ = auVar256._0_4_ * 3.0;
  auVar274._4_4_ = auVar256._4_4_ * 3.0;
  auVar274._8_4_ = auVar256._8_4_ * 3.0;
  auVar274._12_4_ = auVar256._12_4_ * 3.0;
  auVar257 = vminps_avx(auVar263,auVar274);
  auVar256 = vmaxps_avx(auVar263,auVar274);
  auVar257 = vminps_avx(auVar249,auVar257);
  auVar256 = vmaxps_avx(auVar249,auVar256);
  auVar258 = vshufpd_avx(auVar257,auVar257,3);
  auVar281 = vshufpd_avx(auVar256,auVar256,3);
  auVar257 = vminps_avx(auVar257,auVar258);
  auVar256 = vmaxps_avx(auVar256,auVar281);
  auVar264._0_4_ = auVar257._0_4_ * fVar136;
  auVar264._4_4_ = auVar257._4_4_ * fVar136;
  auVar264._8_4_ = auVar257._8_4_ * fVar136;
  auVar264._12_4_ = auVar257._12_4_ * fVar136;
  auVar250._0_4_ = auVar256._0_4_ * fVar136;
  auVar250._4_4_ = auVar256._4_4_ * fVar136;
  auVar250._8_4_ = auVar256._8_4_ * fVar136;
  auVar250._12_4_ = auVar256._12_4_ * fVar136;
  fVar136 = 1.0 / (auVar71._0_4_ - auVar70._0_4_);
  auVar256 = vshufpd_avx(auVar177,auVar177,3);
  auVar257 = vshufpd_avx(auVar289,auVar289,3);
  auVar258 = vshufpd_avx(auVar273,auVar273,3);
  auVar281 = vshufpd_avx(auVar311,auVar311,3);
  auVar256 = vsubps_avx(auVar256,auVar177);
  auVar177 = vsubps_avx(auVar257,auVar289);
  auVar289 = vsubps_avx(auVar258,auVar273);
  auVar281 = vsubps_avx(auVar281,auVar311);
  auVar257 = vminps_avx(auVar256,auVar177);
  auVar256 = vmaxps_avx(auVar256,auVar177);
  auVar258 = vminps_avx(auVar289,auVar281);
  auVar258 = vminps_avx(auVar257,auVar258);
  auVar257 = vmaxps_avx(auVar289,auVar281);
  auVar256 = vmaxps_avx(auVar256,auVar257);
  auVar294._0_4_ = fVar136 * auVar258._0_4_;
  auVar294._4_4_ = fVar136 * auVar258._4_4_;
  auVar294._8_4_ = fVar136 * auVar258._8_4_;
  auVar294._12_4_ = fVar136 * auVar258._12_4_;
  auVar282._0_4_ = fVar136 * auVar256._0_4_;
  auVar282._4_4_ = fVar136 * auVar256._4_4_;
  auVar282._8_4_ = fVar136 * auVar256._8_4_;
  auVar282._12_4_ = fVar136 * auVar256._12_4_;
  auVar281 = vinsertps_avx(auVar13,auVar70,0x10);
  auVar177 = vinsertps_avx(auVar243,auVar71,0x10);
  auVar275._0_4_ = (auVar281._0_4_ + auVar177._0_4_) * 0.5;
  auVar275._4_4_ = (auVar281._4_4_ + auVar177._4_4_) * 0.5;
  auVar275._8_4_ = (auVar281._8_4_ + auVar177._8_4_) * 0.5;
  auVar275._12_4_ = (auVar281._12_4_ + auVar177._12_4_) * 0.5;
  auVar80._4_4_ = auVar275._0_4_;
  auVar80._0_4_ = auVar275._0_4_;
  auVar80._8_4_ = auVar275._0_4_;
  auVar80._12_4_ = auVar275._0_4_;
  auVar256 = vfmadd213ps_fma(auVar15,auVar80,auVar18);
  auVar257 = vfmadd213ps_fma(auVar16,auVar80,auVar19);
  auVar258 = vfmadd213ps_fma(auVar68,auVar80,auVar214);
  auVar243 = vsubps_avx(auVar257,auVar256);
  auVar256 = vfmadd213ps_fma(auVar243,auVar80,auVar256);
  auVar243 = vsubps_avx(auVar258,auVar257);
  auVar243 = vfmadd213ps_fma(auVar243,auVar80,auVar257);
  auVar243 = vsubps_avx(auVar243,auVar256);
  auVar256 = vfmadd231ps_fma(auVar256,auVar243,auVar80);
  auVar81._0_8_ = CONCAT44(auVar243._4_4_ * 3.0,auVar243._0_4_ * 3.0);
  auVar81._8_4_ = auVar243._8_4_ * 3.0;
  auVar81._12_4_ = auVar243._12_4_ * 3.0;
  auVar304._8_8_ = auVar256._0_8_;
  auVar304._0_8_ = auVar256._0_8_;
  auVar243 = vshufpd_avx(auVar256,auVar256,3);
  auVar256 = vshufps_avx(auVar275,auVar275,0x55);
  auVar273 = vsubps_avx(auVar243,auVar304);
  auVar72 = vfmadd231ps_fma(auVar304,auVar256,auVar273);
  auVar318._8_8_ = auVar81._0_8_;
  auVar318._0_8_ = auVar81._0_8_;
  auVar243 = vshufpd_avx(auVar81,auVar81,3);
  auVar243 = vsubps_avx(auVar243,auVar318);
  auVar311 = vfmadd213ps_fma(auVar243,auVar256,auVar318);
  auVar256 = vmovshdup_avx(auVar311);
  auVar319._0_8_ = auVar256._0_8_ ^ 0x8000000080000000;
  auVar319._8_4_ = auVar256._8_4_ ^ 0x80000000;
  auVar319._12_4_ = auVar256._12_4_ ^ 0x80000000;
  auVar257 = vmovshdup_avx(auVar273);
  auVar243 = vunpcklps_avx(auVar257,auVar319);
  auVar258 = vshufps_avx(auVar243,auVar319,4);
  auVar289 = vshufps_avx(auVar275,auVar275,0x54);
  auVar150._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
  auVar150._8_4_ = auVar273._8_4_ ^ 0x80000000;
  auVar150._12_4_ = auVar273._12_4_ ^ 0x80000000;
  auVar243 = vmovlhps_avx(auVar150,auVar311);
  auVar243 = vshufps_avx(auVar243,auVar311,8);
  auVar256 = vfmsub231ss_fma(ZEXT416((uint)(auVar273._0_4_ * auVar256._0_4_)),auVar257,auVar311);
  uVar59 = auVar256._0_4_;
  auVar82._4_4_ = uVar59;
  auVar82._0_4_ = uVar59;
  auVar82._8_4_ = uVar59;
  auVar82._12_4_ = uVar59;
  auVar256 = vdivps_avx(auVar258,auVar82);
  auVar257 = vdivps_avx(auVar243,auVar82);
  fVar116 = auVar72._0_4_;
  fVar136 = auVar256._0_4_;
  auVar243 = vshufps_avx(auVar72,auVar72,0x55);
  fVar90 = auVar257._0_4_;
  auVar83._0_4_ = fVar116 * fVar136 + auVar243._0_4_ * fVar90;
  auVar83._4_4_ = fVar116 * auVar256._4_4_ + auVar243._4_4_ * auVar257._4_4_;
  auVar83._8_4_ = fVar116 * auVar256._8_4_ + auVar243._8_4_ * auVar257._8_4_;
  auVar83._12_4_ = fVar116 * auVar256._12_4_ + auVar243._12_4_ * auVar257._12_4_;
  auVar69 = vsubps_avx(auVar289,auVar83);
  auVar289 = vmovshdup_avx(auVar256);
  auVar243 = vinsertps_avx(auVar264,auVar294,0x1c);
  auVar178._0_4_ = auVar289._0_4_ * auVar243._0_4_;
  auVar178._4_4_ = auVar289._4_4_ * auVar243._4_4_;
  auVar178._8_4_ = auVar289._8_4_ * auVar243._8_4_;
  auVar178._12_4_ = auVar289._12_4_ * auVar243._12_4_;
  auVar258 = vinsertps_avx(auVar250,auVar282,0x1c);
  auVar105._0_4_ = auVar258._0_4_ * auVar289._0_4_;
  auVar105._4_4_ = auVar258._4_4_ * auVar289._4_4_;
  auVar105._8_4_ = auVar258._8_4_ * auVar289._8_4_;
  auVar105._12_4_ = auVar258._12_4_ * auVar289._12_4_;
  auVar72 = vminps_avx(auVar178,auVar105);
  auVar311 = vmaxps_avx(auVar105,auVar178);
  auVar289 = vinsertps_avx(auVar294,auVar264,0x4c);
  auVar317 = vmovshdup_avx(auVar257);
  auVar273 = vinsertps_avx(auVar282,auVar250,0x4c);
  auVar283._0_4_ = auVar317._0_4_ * auVar289._0_4_;
  auVar283._4_4_ = auVar317._4_4_ * auVar289._4_4_;
  auVar283._8_4_ = auVar317._8_4_ * auVar289._8_4_;
  auVar283._12_4_ = auVar317._12_4_ * auVar289._12_4_;
  auVar265._0_4_ = auVar317._0_4_ * auVar273._0_4_;
  auVar265._4_4_ = auVar317._4_4_ * auVar273._4_4_;
  auVar265._8_4_ = auVar317._8_4_ * auVar273._8_4_;
  auVar265._12_4_ = auVar317._12_4_ * auVar273._12_4_;
  auVar317 = vminps_avx(auVar283,auVar265);
  auVar295._0_4_ = auVar72._0_4_ + auVar317._0_4_;
  auVar295._4_4_ = auVar72._4_4_ + auVar317._4_4_;
  auVar295._8_4_ = auVar72._8_4_ + auVar317._8_4_;
  auVar295._12_4_ = auVar72._12_4_ + auVar317._12_4_;
  auVar72 = vmaxps_avx(auVar265,auVar283);
  auVar106._0_4_ = auVar72._0_4_ + auVar311._0_4_;
  auVar106._4_4_ = auVar72._4_4_ + auVar311._4_4_;
  auVar106._8_4_ = auVar72._8_4_ + auVar311._8_4_;
  auVar106._12_4_ = auVar72._12_4_ + auVar311._12_4_;
  auVar266._8_8_ = 0x3f80000000000000;
  auVar266._0_8_ = 0x3f80000000000000;
  auVar311 = vsubps_avx(auVar266,auVar106);
  auVar72 = vsubps_avx(auVar266,auVar295);
  auVar317 = vsubps_avx(auVar281,auVar275);
  auVar146 = vsubps_avx(auVar177,auVar275);
  auVar126._0_4_ = fVar136 * auVar243._0_4_;
  auVar126._4_4_ = fVar136 * auVar243._4_4_;
  auVar126._8_4_ = fVar136 * auVar243._8_4_;
  auVar126._12_4_ = fVar136 * auVar243._12_4_;
  auVar296._0_4_ = fVar136 * auVar258._0_4_;
  auVar296._4_4_ = fVar136 * auVar258._4_4_;
  auVar296._8_4_ = fVar136 * auVar258._8_4_;
  auVar296._12_4_ = fVar136 * auVar258._12_4_;
  auVar258 = vminps_avx(auVar126,auVar296);
  auVar243 = vmaxps_avx(auVar296,auVar126);
  auVar179._0_4_ = fVar90 * auVar289._0_4_;
  auVar179._4_4_ = fVar90 * auVar289._4_4_;
  auVar179._8_4_ = fVar90 * auVar289._8_4_;
  auVar179._12_4_ = fVar90 * auVar289._12_4_;
  auVar251._0_4_ = fVar90 * auVar273._0_4_;
  auVar251._4_4_ = fVar90 * auVar273._4_4_;
  auVar251._8_4_ = fVar90 * auVar273._8_4_;
  auVar251._12_4_ = fVar90 * auVar273._12_4_;
  auVar289 = vminps_avx(auVar179,auVar251);
  auVar297._0_4_ = auVar258._0_4_ + auVar289._0_4_;
  auVar297._4_4_ = auVar258._4_4_ + auVar289._4_4_;
  auVar297._8_4_ = auVar258._8_4_ + auVar289._8_4_;
  auVar297._12_4_ = auVar258._12_4_ + auVar289._12_4_;
  fVar208 = auVar317._0_4_;
  auVar305._0_4_ = fVar208 * auVar311._0_4_;
  fVar224 = auVar317._4_4_;
  auVar305._4_4_ = fVar224 * auVar311._4_4_;
  fVar225 = auVar317._8_4_;
  auVar305._8_4_ = fVar225 * auVar311._8_4_;
  fVar226 = auVar317._12_4_;
  auVar305._12_4_ = fVar226 * auVar311._12_4_;
  auVar258 = vmaxps_avx(auVar251,auVar179);
  auVar252._0_4_ = fVar208 * auVar72._0_4_;
  auVar252._4_4_ = fVar224 * auVar72._4_4_;
  auVar252._8_4_ = fVar225 * auVar72._8_4_;
  auVar252._12_4_ = fVar226 * auVar72._12_4_;
  fVar116 = auVar146._0_4_;
  auVar107._0_4_ = fVar116 * auVar311._0_4_;
  fVar117 = auVar146._4_4_;
  auVar107._4_4_ = fVar117 * auVar311._4_4_;
  fVar118 = auVar146._8_4_;
  auVar107._8_4_ = fVar118 * auVar311._8_4_;
  fVar119 = auVar146._12_4_;
  auVar107._12_4_ = fVar119 * auVar311._12_4_;
  auVar267._0_4_ = fVar116 * auVar72._0_4_;
  auVar267._4_4_ = fVar117 * auVar72._4_4_;
  auVar267._8_4_ = fVar118 * auVar72._8_4_;
  auVar267._12_4_ = fVar119 * auVar72._12_4_;
  auVar127._0_4_ = auVar243._0_4_ + auVar258._0_4_;
  auVar127._4_4_ = auVar243._4_4_ + auVar258._4_4_;
  auVar127._8_4_ = auVar243._8_4_ + auVar258._8_4_;
  auVar127._12_4_ = auVar243._12_4_ + auVar258._12_4_;
  auVar180._8_8_ = 0x3f800000;
  auVar180._0_8_ = 0x3f800000;
  auVar243 = vsubps_avx(auVar180,auVar127);
  auVar258 = vsubps_avx(auVar180,auVar297);
  auVar298._0_4_ = fVar208 * auVar243._0_4_;
  auVar298._4_4_ = fVar224 * auVar243._4_4_;
  auVar298._8_4_ = fVar225 * auVar243._8_4_;
  auVar298._12_4_ = fVar226 * auVar243._12_4_;
  auVar284._0_4_ = fVar208 * auVar258._0_4_;
  auVar284._4_4_ = fVar224 * auVar258._4_4_;
  auVar284._8_4_ = fVar225 * auVar258._8_4_;
  auVar284._12_4_ = fVar226 * auVar258._12_4_;
  auVar128._0_4_ = fVar116 * auVar243._0_4_;
  auVar128._4_4_ = fVar117 * auVar243._4_4_;
  auVar128._8_4_ = fVar118 * auVar243._8_4_;
  auVar128._12_4_ = fVar119 * auVar243._12_4_;
  auVar181._0_4_ = fVar116 * auVar258._0_4_;
  auVar181._4_4_ = fVar117 * auVar258._4_4_;
  auVar181._8_4_ = fVar118 * auVar258._8_4_;
  auVar181._12_4_ = fVar119 * auVar258._12_4_;
  auVar243 = vminps_avx(auVar298,auVar284);
  auVar258 = vminps_avx(auVar128,auVar181);
  auVar243 = vminps_avx(auVar243,auVar258);
  auVar258 = vmaxps_avx(auVar284,auVar298);
  auVar289 = vmaxps_avx(auVar181,auVar128);
  auVar273 = vminps_avx(auVar305,auVar252);
  auVar311 = vminps_avx(auVar107,auVar267);
  auVar273 = vminps_avx(auVar273,auVar311);
  auVar243 = vhaddps_avx(auVar243,auVar273);
  auVar258 = vmaxps_avx(auVar289,auVar258);
  auVar289 = vmaxps_avx(auVar252,auVar305);
  auVar273 = vmaxps_avx(auVar267,auVar107);
  auVar289 = vmaxps_avx(auVar273,auVar289);
  auVar258 = vhaddps_avx(auVar258,auVar289);
  auVar243 = vshufps_avx(auVar243,auVar243,0xe8);
  auVar258 = vshufps_avx(auVar258,auVar258,0xe8);
  auVar268._0_4_ = auVar69._0_4_ + auVar243._0_4_;
  auVar268._4_4_ = auVar69._4_4_ + auVar243._4_4_;
  auVar268._8_4_ = auVar69._8_4_ + auVar243._8_4_;
  auVar268._12_4_ = auVar69._12_4_ + auVar243._12_4_;
  auVar253._0_4_ = auVar69._0_4_ + auVar258._0_4_;
  auVar253._4_4_ = auVar69._4_4_ + auVar258._4_4_;
  auVar253._8_4_ = auVar69._8_4_ + auVar258._8_4_;
  auVar253._12_4_ = auVar69._12_4_ + auVar258._12_4_;
  auVar243 = vmaxps_avx(auVar281,auVar268);
  auVar258 = vminps_avx(auVar253,auVar177);
  auVar243 = vcmpps_avx(auVar258,auVar243,1);
  auVar243 = vshufps_avx(auVar243,auVar243,0x50);
  if ((auVar243 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar243[0xf] < '\0')
  goto LAB_01210878;
  bVar55 = 0;
  if ((auVar222._0_4_ < auVar268._0_4_) && (bVar55 = 0, auVar253._0_4_ < auVar177._0_4_)) {
    auVar258 = vmovshdup_avx(auVar268);
    auVar243 = vcmpps_avx(auVar253,auVar177,1);
    bVar55 = auVar243[4] & auVar70._0_4_ < auVar258._0_4_;
  }
  p03.field_0.i[0] = auVar140._0_4_;
  p03.field_0.i[1] = auVar140._4_4_;
  p03.field_0.i[2] = auVar140._8_4_;
  p03.field_0.i[3] = auVar140._12_4_;
  if (((3 < (uint)uVar57 || fVar66 < 0.001) | bVar55) == 1) {
    lVar60 = 0xc9;
    do {
      lVar60 = lVar60 + -1;
      if (lVar60 == 0) goto LAB_01210878;
      fVar117 = auVar69._0_4_;
      fVar116 = 1.0 - fVar117;
      fVar66 = fVar116 * fVar116 * fVar116;
      fVar88 = fVar117 * 3.0 * fVar116 * fVar116;
      fVar116 = fVar116 * fVar117 * fVar117 * 3.0;
      auVar165._4_4_ = fVar66;
      auVar165._0_4_ = fVar66;
      auVar165._8_4_ = fVar66;
      auVar165._12_4_ = fVar66;
      auVar129._4_4_ = fVar88;
      auVar129._0_4_ = fVar88;
      auVar129._8_4_ = fVar88;
      auVar129._12_4_ = fVar88;
      auVar108._4_4_ = fVar116;
      auVar108._0_4_ = fVar116;
      auVar108._8_4_ = fVar116;
      auVar108._12_4_ = fVar116;
      fVar117 = fVar117 * fVar117 * fVar117;
      auVar182._0_4_ = p03.field_0.v[0] * fVar117;
      auVar182._4_4_ = p03.field_0.v[1] * fVar117;
      auVar182._8_4_ = p03.field_0.v[2] * fVar117;
      auVar182._12_4_ = p03.field_0.v[3] * fVar117;
      auVar13 = vfmadd231ps_fma(auVar182,auVar214,auVar108);
      auVar13 = vfmadd231ps_fma(auVar13,auVar19,auVar129);
      auVar13 = vfmadd231ps_fma(auVar13,auVar18,auVar165);
      auVar109._8_8_ = auVar13._0_8_;
      auVar109._0_8_ = auVar13._0_8_;
      auVar13 = vshufpd_avx(auVar13,auVar13,3);
      auVar243 = vshufps_avx(auVar69,auVar69,0x55);
      auVar13 = vsubps_avx(auVar13,auVar109);
      auVar243 = vfmadd213ps_fma(auVar13,auVar243,auVar109);
      fVar66 = auVar243._0_4_;
      auVar13 = vshufps_avx(auVar243,auVar243,0x55);
      auVar110._0_4_ = fVar136 * fVar66 + fVar90 * auVar13._0_4_;
      auVar110._4_4_ = auVar256._4_4_ * fVar66 + auVar257._4_4_ * auVar13._4_4_;
      auVar110._8_4_ = auVar256._8_4_ * fVar66 + auVar257._8_4_ * auVar13._8_4_;
      auVar110._12_4_ = auVar256._12_4_ * fVar66 + auVar257._12_4_ * auVar13._12_4_;
      auVar69 = vsubps_avx(auVar69,auVar110);
      auVar13 = vandps_avx(local_3e8,auVar243);
      auVar243 = vshufps_avx(auVar13,auVar13,0xf5);
      auVar13 = vmaxss_avx(auVar243,auVar13);
    } while (fVar65 <= auVar13._0_4_);
    local_1f8 = auVar69._0_4_;
    if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
      auVar13 = vmovshdup_avx(auVar69);
      fVar66 = auVar13._0_4_;
      if ((0.0 <= fVar66) && (fVar66 <= 1.0)) {
        auVar13 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar289 = vinsertps_avx(auVar13,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar13 = vdpps_avx(auVar289,local_408,0x7f);
        auVar243 = vdpps_avx(auVar289,local_418,0x7f);
        auVar256 = vdpps_avx(auVar289,auVar17,0x7f);
        auVar257 = vdpps_avx(auVar289,auVar212,0x7f);
        auVar258 = vdpps_avx(auVar289,auVar20,0x7f);
        auVar281 = vdpps_avx(auVar289,auVar21,0x7f);
        auVar177 = vdpps_avx(auVar289,auVar259,0x7f);
        auVar289 = vdpps_avx(auVar289,auVar67,0x7f);
        fVar88 = 1.0 - fVar66;
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar66 * auVar258._0_4_)),ZEXT416((uint)fVar88),
                                  auVar13);
        auVar243 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ * fVar66)),ZEXT416((uint)fVar88),
                                   auVar243);
        auVar256 = vfmadd231ss_fma(ZEXT416((uint)(auVar177._0_4_ * fVar66)),ZEXT416((uint)fVar88),
                                   auVar256);
        auVar257 = vfmadd231ss_fma(ZEXT416((uint)(fVar66 * auVar289._0_4_)),ZEXT416((uint)fVar88),
                                   auVar257);
        fVar90 = 1.0 - local_1f8;
        fVar66 = fVar90 * local_1f8 * local_1f8 * 3.0;
        fVar117 = local_1f8 * local_1f8 * local_1f8;
        auVar256 = vfmadd231ss_fma(ZEXT416((uint)(auVar257._0_4_ * fVar117)),ZEXT416((uint)fVar66),
                                   auVar256);
        fVar88 = local_1f8 * 3.0 * fVar90 * fVar90;
        auVar243 = vfmadd231ss_fma(auVar256,ZEXT416((uint)fVar88),auVar243);
        fVar136 = fVar90 * fVar90 * fVar90;
        auVar13 = vfmadd231ss_fma(auVar243,ZEXT416((uint)fVar136),auVar13);
        fVar116 = auVar13._0_4_;
        if ((fVar64 <= fVar116) && (fVar118 = *(float *)(ray + k * 4 + 0x80), fVar116 <= fVar118)) {
          pGVar6 = (context->scene->geometries).items[uVar53].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar63 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar63 = true, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1e8 = vshufps_avx(auVar69,auVar69,0x55);
            auVar237._8_4_ = 0x3f800000;
            auVar237._0_8_ = 0x3f8000003f800000;
            auVar237._12_4_ = 0x3f800000;
            auVar13 = vsubps_avx(auVar237,local_1e8);
            fVar119 = local_1e8._0_4_;
            auVar254._0_4_ = fVar119 * (float)local_448._0_4_;
            fVar208 = local_1e8._4_4_;
            auVar254._4_4_ = fVar208 * (float)local_448._4_4_;
            fVar224 = local_1e8._8_4_;
            auVar254._8_4_ = fVar224 * fStack_440;
            fVar225 = local_1e8._12_4_;
            auVar254._12_4_ = fVar225 * fStack_43c;
            auVar269._0_4_ = fVar119 * (float)local_458._0_4_;
            auVar269._4_4_ = fVar208 * (float)local_458._4_4_;
            auVar269._8_4_ = fVar224 * fStack_450;
            auVar269._12_4_ = fVar225 * fStack_44c;
            local_4b8 = auVar154._0_4_;
            fStack_4b4 = auVar154._4_4_;
            fStack_4b0 = auVar154._8_4_;
            fStack_4ac = auVar154._12_4_;
            auVar276._0_4_ = fVar119 * local_4b8;
            auVar276._4_4_ = fVar208 * fStack_4b4;
            auVar276._8_4_ = fVar224 * fStack_4b0;
            auVar276._12_4_ = fVar225 * fStack_4ac;
            local_4c8 = auVar155._0_4_;
            fStack_4c4 = auVar155._4_4_;
            fStack_4c0 = auVar155._8_4_;
            fStack_4bc = auVar155._12_4_;
            auVar285._0_4_ = fVar119 * local_4c8;
            auVar285._4_4_ = fVar208 * fStack_4c4;
            auVar285._8_4_ = fVar224 * fStack_4c0;
            auVar285._12_4_ = fVar225 * fStack_4bc;
            auVar243 = vfmadd231ps_fma(auVar254,auVar13,local_428);
            auVar256 = vfmadd231ps_fma(auVar269,auVar13,auVar137);
            auVar257 = vfmadd231ps_fma(auVar276,auVar13,local_438);
            auVar258 = vfmadd231ps_fma(auVar285,auVar13,auVar138);
            auVar13 = vsubps_avx(auVar256,auVar243);
            auVar243 = vsubps_avx(auVar257,auVar256);
            auVar256 = vsubps_avx(auVar258,auVar257);
            auVar277._0_4_ = auVar243._0_4_ * local_1f8;
            auVar277._4_4_ = auVar243._4_4_ * local_1f8;
            auVar277._8_4_ = auVar243._8_4_ * local_1f8;
            auVar277._12_4_ = auVar243._12_4_ * local_1f8;
            auVar204._4_4_ = fVar90;
            auVar204._0_4_ = fVar90;
            auVar204._8_4_ = fVar90;
            auVar204._12_4_ = fVar90;
            auVar13 = vfmadd231ps_fma(auVar277,auVar204,auVar13);
            auVar238._0_4_ = auVar256._0_4_ * local_1f8;
            auVar238._4_4_ = auVar256._4_4_ * local_1f8;
            auVar238._8_4_ = auVar256._8_4_ * local_1f8;
            auVar238._12_4_ = auVar256._12_4_ * local_1f8;
            auVar243 = vfmadd231ps_fma(auVar238,auVar204,auVar243);
            auVar239._0_4_ = auVar243._0_4_ * local_1f8;
            auVar239._4_4_ = auVar243._4_4_ * local_1f8;
            auVar239._8_4_ = auVar243._8_4_ * local_1f8;
            auVar239._12_4_ = auVar243._12_4_ * local_1f8;
            auVar243 = vfmadd231ps_fma(auVar239,auVar204,auVar13);
            local_378 = auVar92._0_4_;
            fStack_374 = auVar92._4_4_;
            fStack_370 = auVar92._8_4_;
            fStack_36c = auVar92._12_4_;
            auVar183._0_4_ = fVar117 * local_378;
            auVar183._4_4_ = fVar117 * fStack_374;
            auVar183._8_4_ = fVar117 * fStack_370;
            auVar183._12_4_ = fVar117 * fStack_36c;
            auVar130._4_4_ = fVar66;
            auVar130._0_4_ = fVar66;
            auVar130._8_4_ = fVar66;
            auVar130._12_4_ = fVar66;
            auVar13 = vfmadd132ps_fma(auVar130,auVar183,auVar120);
            auVar166._4_4_ = fVar88;
            auVar166._0_4_ = fVar88;
            auVar166._8_4_ = fVar88;
            auVar166._12_4_ = fVar88;
            auVar13 = vfmadd132ps_fma(auVar166,auVar13,auVar94);
            auVar131._0_4_ = auVar243._0_4_ * 3.0;
            auVar131._4_4_ = auVar243._4_4_ * 3.0;
            auVar131._8_4_ = auVar243._8_4_ * 3.0;
            auVar131._12_4_ = auVar243._12_4_ * 3.0;
            auVar151._4_4_ = fVar136;
            auVar151._0_4_ = fVar136;
            auVar151._8_4_ = fVar136;
            auVar151._12_4_ = fVar136;
            auVar243 = vfmadd132ps_fma(auVar151,auVar13,auVar93);
            auVar13 = vshufps_avx(auVar131,auVar131,0xc9);
            auVar167._0_4_ = auVar243._0_4_ * auVar13._0_4_;
            auVar167._4_4_ = auVar243._4_4_ * auVar13._4_4_;
            auVar167._8_4_ = auVar243._8_4_ * auVar13._8_4_;
            auVar167._12_4_ = auVar243._12_4_ * auVar13._12_4_;
            auVar13 = vshufps_avx(auVar243,auVar243,0xc9);
            auVar243 = vfmsub231ps_fma(auVar167,auVar131,auVar13);
            auVar13 = vshufps_avx(auVar243,auVar243,0x55);
            local_228[0] = (RTCHitN)auVar13[0];
            local_228[1] = (RTCHitN)auVar13[1];
            local_228[2] = (RTCHitN)auVar13[2];
            local_228[3] = (RTCHitN)auVar13[3];
            local_228[4] = (RTCHitN)auVar13[4];
            local_228[5] = (RTCHitN)auVar13[5];
            local_228[6] = (RTCHitN)auVar13[6];
            local_228[7] = (RTCHitN)auVar13[7];
            local_228[8] = (RTCHitN)auVar13[8];
            local_228[9] = (RTCHitN)auVar13[9];
            local_228[10] = (RTCHitN)auVar13[10];
            local_228[0xb] = (RTCHitN)auVar13[0xb];
            local_228[0xc] = (RTCHitN)auVar13[0xc];
            local_228[0xd] = (RTCHitN)auVar13[0xd];
            local_228[0xe] = (RTCHitN)auVar13[0xe];
            local_228[0xf] = (RTCHitN)auVar13[0xf];
            local_218 = vshufps_avx(auVar243,auVar243,0xaa);
            local_208 = auVar243._0_4_;
            uStack_204 = local_208;
            uStack_200 = local_208;
            uStack_1fc = local_208;
            fStack_1f4 = local_1f8;
            fStack_1f0 = local_1f8;
            fStack_1ec = local_1f8;
            local_1d8 = CONCAT44(uVar5,uVar5);
            uStack_1d0 = CONCAT44(uVar5,uVar5);
            local_1c8._4_4_ = uVar53;
            local_1c8._0_4_ = uVar53;
            local_1c8._8_4_ = uVar53;
            local_1c8._12_4_ = uVar53;
            vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
            uStack_1b4 = context->user->instID[0];
            local_1b8 = uStack_1b4;
            uStack_1b0 = uStack_1b4;
            uStack_1ac = uStack_1b4;
            uStack_1a8 = context->user->instPrimID[0];
            uStack_1a4 = uStack_1a8;
            uStack_1a0 = uStack_1a8;
            uStack_19c = uStack_1a8;
            *(float *)(ray + k * 4 + 0x80) = fVar116;
            local_478 = *local_468;
            args.valid = (int *)local_478;
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_228;
            args.N = 4;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar6->occlusionFilterN)(&args);
            }
            if (local_478 == (undefined1  [16])0x0) {
              auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar13 = auVar13 ^ _DAT_01f46b70;
            }
            else {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var12)(&args);
              }
              auVar243 = vpcmpeqd_avx(local_478,_DAT_01f45a50);
              auVar13 = auVar243 ^ _DAT_01f46b70;
              auVar132._8_4_ = 0xff800000;
              auVar132._0_8_ = 0xff800000ff800000;
              auVar132._12_4_ = 0xff800000;
              auVar243 = vblendvps_avx(auVar132,*(undefined1 (*) [16])(args.ray + 0x80),auVar243);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar243;
            }
            auVar111._8_8_ = 0x100000001;
            auVar111._0_8_ = 0x100000001;
            bVar63 = (auVar111 & auVar13) != (undefined1  [16])0x0;
            if (!bVar63) {
              *(float *)(ray + k * 4 + 0x80) = fVar118;
            }
          }
          bVar62 = (bool)(bVar62 | bVar63);
        }
      }
    }
    goto LAB_01210878;
  }
  auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar88),0x10);
  auVar72 = vinsertps_avx(auVar70,ZEXT416((uint)auVar71._0_4_),0x10);
  goto LAB_012102c7;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }